

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar62 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  int iVar98;
  float fVar99;
  undefined4 uVar100;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  vint4 bi;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar119;
  float fVar126;
  float fVar127;
  vfloat4 a0;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar128;
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  vint4 ai_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  vint4 ai;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar169;
  float fVar178;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  vfloat4 a0_3;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  float fVar207;
  float fVar216;
  float fVar217;
  vfloat4 b0_2;
  undefined1 auVar208 [16];
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  vfloat4 a0_4;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar252 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_398 [16];
  ulong local_388;
  Primitive *local_380;
  RTCFilterFunctionNArguments local_378;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  uint auStack_328 [4];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar27;
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  float fVar129;
  float fVar138;
  float fVar139;
  float fVar153;
  float fVar154;
  float fVar168;
  
  PVar5 = prim[1];
  uVar25 = (ulong)(byte)PVar5;
  lVar28 = uVar25 * 0x25;
  fVar99 = *(float *)(prim + lVar28 + 0x12);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar40 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar40 = vinsertps_avx(auVar40,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar39 = vsubps_avx(auVar39,*(undefined1 (*) [16])(prim + lVar28 + 6));
  auVar63._0_4_ = fVar99 * auVar39._0_4_;
  auVar63._4_4_ = fVar99 * auVar39._4_4_;
  auVar63._8_4_ = fVar99 * auVar39._8_4_;
  auVar63._12_4_ = fVar99 * auVar39._12_4_;
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 4 + 6)));
  auVar43._0_4_ = fVar99 * auVar40._0_4_;
  auVar43._4_4_ = fVar99 * auVar40._4_4_;
  auVar43._8_4_ = fVar99 * auVar40._8_4_;
  auVar43._12_4_ = fVar99 * auVar40._12_4_;
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 5 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 6 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0xf + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar53 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar53 = vcvtdq2ps_avx(auVar53);
  auVar54 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar25 + 6)));
  auVar54 = vcvtdq2ps_avx(auVar54);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1a + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1b + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar57 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 * 0x1c + 6)));
  auVar57 = vcvtdq2ps_avx(auVar57);
  auVar140._4_4_ = auVar43._0_4_;
  auVar140._0_4_ = auVar43._0_4_;
  auVar140._8_4_ = auVar43._0_4_;
  auVar140._12_4_ = auVar43._0_4_;
  auVar58 = vshufps_avx(auVar43,auVar43,0x55);
  auVar59 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar99 = auVar59._0_4_;
  auVar56._0_4_ = fVar99 * auVar50._0_4_;
  fVar221 = auVar59._4_4_;
  auVar56._4_4_ = fVar221 * auVar50._4_4_;
  fVar207 = auVar59._8_4_;
  auVar56._8_4_ = fVar207 * auVar50._8_4_;
  fVar216 = auVar59._12_4_;
  auVar56._12_4_ = fVar216 * auVar50._12_4_;
  auVar48._0_4_ = auVar54._0_4_ * fVar99;
  auVar48._4_4_ = auVar54._4_4_ * fVar221;
  auVar48._8_4_ = auVar54._8_4_ * fVar207;
  auVar48._12_4_ = auVar54._12_4_ * fVar216;
  auVar42._0_4_ = auVar57._0_4_ * fVar99;
  auVar42._4_4_ = auVar57._4_4_ * fVar221;
  auVar42._8_4_ = auVar57._8_4_ * fVar207;
  auVar42._12_4_ = auVar57._12_4_ * fVar216;
  auVar59 = vfmadd231ps_fma(auVar56,auVar58,auVar40);
  auVar15 = vfmadd231ps_fma(auVar48,auVar58,auVar53);
  auVar58 = vfmadd231ps_fma(auVar42,auVar52,auVar58);
  auVar16 = vfmadd231ps_fma(auVar59,auVar140,auVar39);
  auVar15 = vfmadd231ps_fma(auVar15,auVar140,auVar49);
  auVar60 = vfmadd231ps_fma(auVar58,auVar51,auVar140);
  auVar239._4_4_ = auVar63._0_4_;
  auVar239._0_4_ = auVar63._0_4_;
  auVar239._8_4_ = auVar63._0_4_;
  auVar239._12_4_ = auVar63._0_4_;
  auVar58 = vshufps_avx(auVar63,auVar63,0x55);
  auVar59 = vshufps_avx(auVar63,auVar63,0xaa);
  fVar99 = auVar59._0_4_;
  auVar141._0_4_ = fVar99 * auVar50._0_4_;
  fVar221 = auVar59._4_4_;
  auVar141._4_4_ = fVar221 * auVar50._4_4_;
  fVar207 = auVar59._8_4_;
  auVar141._8_4_ = fVar207 * auVar50._8_4_;
  fVar216 = auVar59._12_4_;
  auVar141._12_4_ = fVar216 * auVar50._12_4_;
  auVar65._0_4_ = auVar54._0_4_ * fVar99;
  auVar65._4_4_ = auVar54._4_4_ * fVar221;
  auVar65._8_4_ = auVar54._8_4_ * fVar207;
  auVar65._12_4_ = auVar54._12_4_ * fVar216;
  auVar64._0_4_ = auVar57._0_4_ * fVar99;
  auVar64._4_4_ = auVar57._4_4_ * fVar221;
  auVar64._8_4_ = auVar57._8_4_ * fVar207;
  auVar64._12_4_ = auVar57._12_4_ * fVar216;
  auVar40 = vfmadd231ps_fma(auVar141,auVar58,auVar40);
  auVar50 = vfmadd231ps_fma(auVar65,auVar58,auVar53);
  auVar53 = vfmadd231ps_fma(auVar64,auVar58,auVar52);
  auVar41 = vfmadd231ps_fma(auVar40,auVar239,auVar39);
  auVar43 = vfmadd231ps_fma(auVar50,auVar239,auVar49);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar256 = ZEXT1664(auVar39);
  auVar42 = vfmadd231ps_fma(auVar53,auVar239,auVar51);
  auVar40 = vandps_avx512vl(auVar16,auVar39);
  auVar170._8_4_ = 0x219392ef;
  auVar170._0_8_ = 0x219392ef219392ef;
  auVar170._12_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar40,auVar170,1);
  bVar35 = (bool)((byte)uVar37 & 1);
  auVar44._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar16._0_4_;
  bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar16._4_4_;
  bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar16._8_4_;
  bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar16._12_4_;
  auVar40 = vandps_avx512vl(auVar15,auVar39);
  uVar37 = vcmpps_avx512vl(auVar40,auVar170,1);
  bVar35 = (bool)((byte)uVar37 & 1);
  auVar45._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar15._0_4_;
  bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar15._4_4_;
  bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar15._8_4_;
  bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar15._12_4_;
  auVar39 = vandps_avx512vl(auVar60,auVar39);
  uVar37 = vcmpps_avx512vl(auVar39,auVar170,1);
  bVar35 = (bool)((byte)uVar37 & 1);
  auVar46._0_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar60._0_4_;
  bVar35 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar60._4_4_;
  bVar35 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar60._8_4_;
  bVar35 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar35 * 0x219392ef | (uint)!bVar35 * auVar60._12_4_;
  auVar40 = vrcp14ps_avx512vl(auVar44);
  auVar171._8_4_ = 0x3f800000;
  auVar171._0_8_ = 0x3f8000003f800000;
  auVar171._12_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar44,auVar40,auVar171);
  auVar16 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar45);
  auVar39 = vfnmadd213ps_fma(auVar45,auVar40,auVar171);
  auVar60 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar46);
  auVar39 = vfnmadd213ps_fma(auVar46,auVar40,auVar171);
  auVar61 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  fVar99 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar28 + 0x16)) *
           *(float *)(prim + lVar28 + 0x1a);
  auVar155._4_4_ = fVar99;
  auVar155._0_4_ = fVar99;
  auVar155._8_4_ = fVar99;
  auVar155._12_4_ = fVar99;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar25 * 7 + 6);
  auVar39 = vpmovsxwd_avx(auVar39);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar25 * 0xb + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar49 = vsubps_avx(auVar40,auVar39);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar25 * 9 + 6);
  auVar40 = vpmovsxwd_avx(auVar50);
  auVar50 = vfmadd213ps_fma(auVar49,auVar155,auVar39);
  auVar39 = vcvtdq2ps_avx(auVar40);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar25 * 0xd + 6);
  auVar40 = vpmovsxwd_avx(auVar49);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar49 = vfmadd213ps_fma(auVar40,auVar155,auVar39);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar25 * 0x12 + 6);
  auVar39 = vpmovsxwd_avx(auVar53);
  auVar39 = vcvtdq2ps_avx(auVar39);
  uVar37 = (ulong)(uint)((int)(uVar25 * 5) << 2);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar25 * 2 + uVar37 + 6);
  auVar40 = vpmovsxwd_avx(auVar54);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar53 = vfmadd213ps_fma(auVar40,auVar155,auVar39);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar37 + 6);
  auVar39 = vpmovsxwd_avx(auVar51);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar25 * 0x18 + 6);
  auVar40 = vpmovsxwd_avx(auVar52);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar54 = vfmadd213ps_fma(auVar40,auVar155,auVar39);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar25 * 0x1d + 6);
  auVar39 = vpmovsxwd_avx(auVar57);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar25 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar40 = vpmovsxwd_avx(auVar58);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar51 = vfmadd213ps_fma(auVar40,auVar155,auVar39);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar25) + 6);
  auVar39 = vpmovsxwd_avx(auVar59);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar25 * 0x23 + 6);
  auVar40 = vpmovsxwd_avx(auVar15);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar40 = vfmadd213ps_fma(auVar40,auVar155,auVar39);
  auVar39 = vsubps_avx(auVar50,auVar41);
  auVar156._0_4_ = auVar16._0_4_ * auVar39._0_4_;
  auVar156._4_4_ = auVar16._4_4_ * auVar39._4_4_;
  auVar156._8_4_ = auVar16._8_4_ * auVar39._8_4_;
  auVar156._12_4_ = auVar16._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar49,auVar41);
  auVar62._0_4_ = auVar16._0_4_ * auVar39._0_4_;
  auVar62._4_4_ = auVar16._4_4_ * auVar39._4_4_;
  auVar62._8_4_ = auVar16._8_4_ * auVar39._8_4_;
  auVar62._12_4_ = auVar16._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar53,auVar43);
  auVar142._0_4_ = auVar60._0_4_ * auVar39._0_4_;
  auVar142._4_4_ = auVar60._4_4_ * auVar39._4_4_;
  auVar142._8_4_ = auVar60._8_4_ * auVar39._8_4_;
  auVar142._12_4_ = auVar60._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar54,auVar43);
  auVar55._0_4_ = auVar60._0_4_ * auVar39._0_4_;
  auVar55._4_4_ = auVar60._4_4_ * auVar39._4_4_;
  auVar55._8_4_ = auVar60._8_4_ * auVar39._8_4_;
  auVar55._12_4_ = auVar60._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar51,auVar42);
  auVar130._0_4_ = auVar61._0_4_ * auVar39._0_4_;
  auVar130._4_4_ = auVar61._4_4_ * auVar39._4_4_;
  auVar130._8_4_ = auVar61._8_4_ * auVar39._8_4_;
  auVar130._12_4_ = auVar61._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar40,auVar42);
  auVar47._0_4_ = auVar61._0_4_ * auVar39._0_4_;
  auVar47._4_4_ = auVar61._4_4_ * auVar39._4_4_;
  auVar47._8_4_ = auVar61._8_4_ * auVar39._8_4_;
  auVar47._12_4_ = auVar61._12_4_ * auVar39._12_4_;
  auVar39 = vpminsd_avx(auVar156,auVar62);
  auVar40 = vpminsd_avx(auVar142,auVar55);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar40 = vpminsd_avx(auVar130,auVar47);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar16._4_4_ = uVar100;
  auVar16._0_4_ = uVar100;
  auVar16._8_4_ = uVar100;
  auVar16._12_4_ = uVar100;
  auVar40 = vmaxps_avx512vl(auVar40,auVar16);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar60._8_4_ = 0x3f7ffffa;
  auVar60._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar60._12_4_ = 0x3f7ffffa;
  local_2e8 = vmulps_avx512vl(auVar39,auVar60);
  auVar39 = vpmaxsd_avx(auVar156,auVar62);
  auVar40 = vpmaxsd_avx(auVar142,auVar55);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar40 = vpmaxsd_avx(auVar130,auVar47);
  uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar61._4_4_ = uVar100;
  auVar61._0_4_ = uVar100;
  auVar61._8_4_ = uVar100;
  auVar61._12_4_ = uVar100;
  auVar40 = vminps_avx512vl(auVar40,auVar61);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar41._8_4_ = 0x3f800003;
  auVar41._0_8_ = 0x3f8000033f800003;
  auVar41._12_4_ = 0x3f800003;
  auVar39 = vmulps_avx512vl(auVar39,auVar41);
  auVar40 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_2e8,auVar39,2);
  uVar37 = vpcmpgtd_avx512vl(auVar40,_DAT_01f7fcf0);
  uVar37 = ((byte)uVar13 & 0xf) & uVar37;
  if ((char)uVar37 != '\0') {
    local_318 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar39 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
    auVar252 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar255 = ZEXT1664(auVar39);
    local_380 = prim;
    do {
      lVar28 = 0;
      for (uVar25 = uVar37; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar25 = (ulong)*(uint *)(local_380 + 2);
      pGVar7 = (context->scene->geometries).items[uVar25].ptr;
      fVar99 = (pGVar7->time_range).lower;
      fVar99 = pGVar7->fnumTimeSegments *
               ((*(float *)(ray + k * 4 + 0x70) - fVar99) / ((pGVar7->time_range).upper - fVar99));
      auVar39 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),9);
      uVar32 = *(uint *)(local_380 + lVar28 * 4 + 6);
      auVar40 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar39 = vminss_avx(auVar39,auVar40);
      auVar41 = vmaxss_avx512f(auVar252._0_16_,auVar39);
      uVar26 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               (ulong)uVar32 *
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar30 = (long)(int)auVar41._0_4_ * 0x38;
      lVar9 = *(long *)(_Var8 + lVar30);
      lVar10 = *(long *)(_Var8 + 0x10 + lVar30);
      auVar39 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar26);
      lVar28 = uVar26 + 1;
      auVar40 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar28);
      lVar1 = uVar26 + 2;
      auVar50 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
      lVar2 = uVar26 + 3;
      auVar49 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
      lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
      lVar10 = *(long *)(lVar9 + lVar30);
      lVar11 = *(long *)(lVar9 + 0x10 + lVar30);
      auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar26);
      auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar28);
      auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
      lVar10 = *(long *)(_Var8 + 0x38 + lVar30);
      lVar11 = *(long *)(_Var8 + 0x48 + lVar30);
      auVar57 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar26);
      auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar28);
      auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
      auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
      lVar10 = *(long *)(lVar9 + 0x38 + lVar30);
      lVar9 = *(long *)(lVar9 + 0x48 + lVar30);
      auVar16 = *(undefined1 (*) [16])(lVar10 + uVar26 * lVar9);
      auVar60 = *(undefined1 (*) [16])(lVar10 + lVar28 * lVar9);
      auVar61 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
      auVar42 = vsubss_avx512f(ZEXT416((uint)fVar99),auVar41);
      auVar101._0_12_ = ZEXT812(0);
      auVar101._12_4_ = 0;
      auVar41 = vmulps_avx512vl(auVar49,auVar101);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar50,auVar101);
      auVar43 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar40,auVar41);
      auVar44 = vaddps_avx512vl(auVar39,auVar43);
      auVar62 = auVar255._0_16_;
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar40,auVar62);
      auVar45 = vfnmadd231ps_avx512vl(auVar41,auVar39,auVar62);
      auVar120._0_4_ = auVar52._0_4_ * 0.0;
      auVar120._4_4_ = auVar52._4_4_ * 0.0;
      auVar120._8_4_ = auVar52._8_4_ * 0.0;
      auVar120._12_4_ = auVar52._12_4_ * 0.0;
      auVar41 = vfmadd231ps_fma(auVar120,auVar51,auVar101);
      auVar43 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar54,auVar41);
      auVar46 = vaddps_avx512vl(auVar53,auVar43);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar54,auVar62);
      auVar47 = vfnmadd231ps_avx512vl(auVar41,auVar53,auVar62);
      auVar41 = vxorps_avx512vl(auVar43,auVar43);
      auVar41 = vfmadd213ps_avx512vl(auVar41,auVar50,auVar49);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar40,auVar101);
      auVar48 = vfmadd231ps_avx512vl(auVar41,auVar39,auVar101);
      auVar49 = vmulps_avx512vl(auVar49,auVar62);
      auVar50 = vfnmadd231ps_avx512vl(auVar49,auVar62,auVar50);
      auVar40 = vfmadd231ps_fma(auVar50,auVar101,auVar40);
      auVar43 = vfnmadd231ps_fma(auVar40,auVar101,auVar39);
      auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar51,auVar52);
      auVar39 = vfmadd231ps_fma(auVar39,auVar54,auVar101);
      auVar41 = vfmadd231ps_fma(auVar39,auVar53,auVar101);
      auVar39 = vmulps_avx512vl(auVar52,auVar62);
      auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar62,auVar51);
      auVar39 = vfmadd231ps_fma(auVar39,auVar101,auVar54);
      auVar54 = vfnmadd231ps_fma(auVar39,auVar101,auVar53);
      auVar40 = vshufps_avx512vl(auVar45,auVar45,0xc9);
      auVar39 = vshufps_avx512vl(auVar46,auVar46,0xc9);
      auVar39 = vmulps_avx512vl(auVar45,auVar39);
      auVar39 = vfmsub231ps_avx512vl(auVar39,auVar40,auVar46);
      auVar50 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar39 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar39 = vmulps_avx512vl(auVar45,auVar39);
      auVar39 = vfmsub231ps_fma(auVar39,auVar40,auVar47);
      auVar49 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar39 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar40 = vshufps_avx(auVar41,auVar41,0xc9);
      auVar157._0_4_ = auVar43._0_4_ * auVar40._0_4_;
      auVar157._4_4_ = auVar43._4_4_ * auVar40._4_4_;
      auVar157._8_4_ = auVar43._8_4_ * auVar40._8_4_;
      auVar157._12_4_ = auVar43._12_4_ * auVar40._12_4_;
      auVar40 = vfmsub231ps_fma(auVar157,auVar39,auVar41);
      auVar53 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar40 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar158._0_4_ = auVar43._0_4_ * auVar40._0_4_;
      auVar158._4_4_ = auVar43._4_4_ * auVar40._4_4_;
      auVar158._8_4_ = auVar43._8_4_ * auVar40._8_4_;
      auVar158._12_4_ = auVar43._12_4_ * auVar40._12_4_;
      auVar39 = vfmsub231ps_fma(auVar158,auVar39,auVar54);
      auVar54 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar39 = vdpps_avx(auVar50,auVar50,0x7f);
      auVar40 = vrsqrt14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar51 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
      auVar52 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
      auVar52 = vmulss_avx512f(auVar52,auVar40);
      auVar40 = vmulss_avx512f(auVar52,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
      fVar207 = auVar51._0_4_ - auVar40._0_4_;
      auVar179._4_4_ = fVar207;
      auVar179._0_4_ = fVar207;
      auVar179._8_4_ = fVar207;
      auVar179._12_4_ = fVar207;
      auVar40 = vdpps_avx(auVar50,auVar49,0x7f);
      auVar51 = vmulps_avx512vl(auVar50,auVar179);
      auVar52 = vbroadcastss_avx512vl(auVar39);
      auVar49 = vmulps_avx512vl(auVar52,auVar49);
      fVar99 = auVar40._0_4_;
      auVar143._0_4_ = fVar99 * auVar50._0_4_;
      auVar143._4_4_ = fVar99 * auVar50._4_4_;
      auVar143._8_4_ = fVar99 * auVar50._8_4_;
      auVar143._12_4_ = fVar99 * auVar50._12_4_;
      auVar50 = vsubps_avx(auVar49,auVar143);
      auVar40 = vrcp14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar39 = vfnmadd213ss_avx512f(auVar39,auVar40,ZEXT416(0x40000000));
      fVar99 = auVar40._0_4_ * auVar39._0_4_;
      auVar39 = vdpps_avx(auVar53,auVar53,0x7f);
      auVar40 = vrsqrt14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar49 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
      auVar52 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
      fVar221 = auVar40._0_4_;
      fVar216 = auVar49._0_4_ - auVar52._0_4_ * fVar221 * fVar221 * fVar221;
      auVar180._0_4_ = auVar53._0_4_ * fVar216;
      auVar180._4_4_ = auVar53._4_4_ * fVar216;
      auVar180._8_4_ = auVar53._8_4_ * fVar216;
      auVar180._12_4_ = auVar53._12_4_ * fVar216;
      auVar40 = vdpps_avx(auVar53,auVar54,0x7f);
      auVar49 = vbroadcastss_avx512vl(auVar39);
      auVar49 = vmulps_avx512vl(auVar49,auVar54);
      fVar221 = auVar40._0_4_;
      auVar108._0_4_ = fVar221 * auVar53._0_4_;
      auVar108._4_4_ = fVar221 * auVar53._4_4_;
      auVar108._8_4_ = fVar221 * auVar53._8_4_;
      auVar108._12_4_ = fVar221 * auVar53._12_4_;
      auVar40 = vsubps_avx(auVar49,auVar108);
      auVar49 = vrcp14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar39 = vfnmadd213ss_avx512f(auVar39,auVar49,ZEXT416(0x40000000));
      fVar221 = auVar49._0_4_ * auVar39._0_4_;
      auVar39 = vshufps_avx512vl(auVar44,auVar44,0xff);
      auVar49 = vmulps_avx512vl(auVar39,auVar51);
      auVar52 = vsubps_avx512vl(auVar44,auVar49);
      auVar53 = vshufps_avx512vl(auVar45,auVar45,0xff);
      auVar53 = vmulps_avx512vl(auVar53,auVar51);
      auVar131._0_4_ = auVar53._0_4_ + auVar39._0_4_ * fVar207 * fVar99 * auVar50._0_4_;
      auVar131._4_4_ = auVar53._4_4_ + auVar39._4_4_ * fVar207 * fVar99 * auVar50._4_4_;
      auVar131._8_4_ = auVar53._8_4_ + auVar39._8_4_ * fVar207 * fVar99 * auVar50._8_4_;
      auVar131._12_4_ = auVar53._12_4_ + auVar39._12_4_ * fVar207 * fVar99 * auVar50._12_4_;
      auVar50 = vsubps_avx512vl(auVar45,auVar131);
      auVar41 = vaddps_avx512vl(auVar44,auVar49);
      auVar49 = vaddps_avx512vl(auVar45,auVar131);
      auVar39 = vshufps_avx512vl(auVar48,auVar48,0xff);
      auVar53 = vmulps_avx512vl(auVar39,auVar180);
      auVar44 = vsubps_avx512vl(auVar48,auVar53);
      auVar54 = vshufps_avx512vl(auVar43,auVar43,0xff);
      auVar51 = vmulps_avx512vl(auVar54,auVar180);
      auVar181._0_4_ = auVar51._0_4_ + auVar39._0_4_ * fVar216 * auVar40._0_4_ * fVar221;
      auVar181._4_4_ = auVar51._4_4_ + auVar39._4_4_ * fVar216 * auVar40._4_4_ * fVar221;
      auVar181._8_4_ = auVar51._8_4_ + auVar39._8_4_ * fVar216 * auVar40._8_4_ * fVar221;
      auVar181._12_4_ = auVar51._12_4_ + auVar39._12_4_ * fVar216 * auVar40._12_4_ * fVar221;
      auVar39 = vsubps_avx(auVar43,auVar181);
      auVar45 = vaddps_avx512vl(auVar48,auVar53);
      auVar53 = vaddps_avx512vl(auVar43,auVar181);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar40 = vmulps_avx512vl(auVar50,auVar43);
      auVar172._0_4_ = auVar52._0_4_ + auVar40._0_4_;
      auVar172._4_4_ = auVar52._4_4_ + auVar40._4_4_;
      auVar172._8_4_ = auVar52._8_4_ + auVar40._8_4_;
      auVar172._12_4_ = auVar52._12_4_ + auVar40._12_4_;
      auVar39 = vmulps_avx512vl(auVar39,auVar43);
      auVar51 = vsubps_avx(auVar44,auVar39);
      auVar39 = vmulps_avx512vl(auVar49,auVar43);
      auVar46 = vaddps_avx512vl(auVar41,auVar39);
      auVar39 = vmulps_avx512vl(auVar53,auVar43);
      auVar47 = vsubps_avx512vl(auVar45,auVar39);
      auVar39 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
      auVar40 = vmulps_avx512vl(auVar15,auVar101);
      auVar40 = vfmadd231ps_fma(auVar40,auVar59,auVar101);
      auVar50 = vxorps_avx512vl(auVar53,auVar53);
      auVar50 = vfmadd213ps_avx512vl(auVar50,auVar58,auVar40);
      auVar48 = vaddps_avx512vl(auVar57,auVar50);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar58,auVar62);
      auVar55 = vfnmadd231ps_avx512vl(auVar40,auVar57,auVar62);
      auVar40 = vmulps_avx512vl(auVar39,auVar101);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar61,auVar101);
      auVar50 = vxorps_avx512vl(auVar54,auVar54);
      auVar50 = vfmadd213ps_avx512vl(auVar50,auVar60,auVar40);
      auVar49 = vaddps_avx512vl(auVar16,auVar50);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar60,auVar62);
      auVar53 = vfnmadd231ps_avx512vl(auVar40,auVar16,auVar62);
      auVar40 = vxorps_avx512vl(auVar50,auVar50);
      auVar40 = vfmadd213ps_avx512vl(auVar40,auVar59,auVar15);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar58,auVar101);
      auVar56 = vfmadd231ps_avx512vl(auVar40,auVar57,auVar101);
      auVar40 = vmulps_avx512vl(auVar15,auVar62);
      auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar62,auVar59);
      auVar40 = vfmadd231ps_avx512vl(auVar40,auVar101,auVar58);
      auVar57 = vfnmadd231ps_avx512vl(auVar40,auVar101,auVar57);
      auVar40 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar61,auVar39);
      auVar40 = vfmadd231ps_fma(auVar40,auVar60,auVar101);
      auVar40 = vfmadd231ps_fma(auVar40,auVar16,auVar101);
      auVar39 = vmulps_avx512vl(auVar39,auVar62);
      auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar62,auVar61);
      auVar39 = vfmadd231ps_fma(auVar39,auVar101,auVar60);
      auVar54 = vfnmadd231ps_fma(auVar39,auVar101,auVar16);
      auVar39 = vshufps_avx(auVar55,auVar55,0xc9);
      auVar50 = vshufps_avx512vl(auVar49,auVar49,0xc9);
      fVar216 = auVar55._0_4_;
      auVar222._0_4_ = fVar216 * auVar50._0_4_;
      fVar217 = auVar55._4_4_;
      auVar222._4_4_ = fVar217 * auVar50._4_4_;
      fVar129 = auVar55._8_4_;
      auVar222._8_4_ = fVar129 * auVar50._8_4_;
      fVar138 = auVar55._12_4_;
      auVar222._12_4_ = fVar138 * auVar50._12_4_;
      auVar50 = vfmsub231ps_avx512vl(auVar222,auVar39,auVar49);
      auVar50 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar49 = vshufps_avx512vl(auVar53,auVar53,0xc9);
      auVar231._0_4_ = fVar216 * auVar49._0_4_;
      auVar231._4_4_ = fVar217 * auVar49._4_4_;
      auVar231._8_4_ = fVar129 * auVar49._8_4_;
      auVar231._12_4_ = fVar138 * auVar49._12_4_;
      auVar39 = vfmsub231ps_avx512vl(auVar231,auVar39,auVar53);
      auVar49 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar58 = vshufps_avx512vl(auVar57,auVar57,0xc9);
      auVar39 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar39 = vmulps_avx512vl(auVar57,auVar39);
      auVar39 = vfmsub231ps_fma(auVar39,auVar58,auVar40);
      auVar53 = vshufps_avx(auVar39,auVar39,0xc9);
      auVar40 = vshufps_avx(auVar54,auVar54,0xc9);
      auVar39 = vdpps_avx(auVar50,auVar50,0x7f);
      auVar40 = vmulps_avx512vl(auVar57,auVar40);
      auVar40 = vfmsub231ps_fma(auVar40,auVar58,auVar54);
      auVar54 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar40 = vrsqrt14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar58 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
      auVar59 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
      auVar59 = vmulss_avx512f(auVar59,auVar40);
      auVar40 = vmulss_avx512f(auVar59,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
      auVar40 = vsubss_avx512f(auVar58,auVar40);
      auVar245._0_4_ = auVar40._0_4_;
      auVar245._4_4_ = auVar245._0_4_;
      auVar245._8_4_ = auVar245._0_4_;
      auVar245._12_4_ = auVar245._0_4_;
      auVar58 = vmulps_avx512vl(auVar50,auVar245);
      auVar40 = vdpps_avx(auVar50,auVar49,0x7f);
      auVar59 = vbroadcastss_avx512vl(auVar39);
      auVar49 = vmulps_avx512vl(auVar59,auVar49);
      fVar99 = auVar40._0_4_;
      auVar159._0_4_ = auVar50._0_4_ * fVar99;
      auVar159._4_4_ = auVar50._4_4_ * fVar99;
      auVar159._8_4_ = auVar50._8_4_ * fVar99;
      auVar159._12_4_ = auVar50._12_4_ * fVar99;
      auVar50 = vsubps_avx(auVar49,auVar159);
      auVar40 = vrcp14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar39 = vfnmadd213ss_avx512f(auVar39,auVar40,ZEXT416(0x40000000));
      fVar99 = auVar40._0_4_ * auVar39._0_4_;
      auVar39 = vdpps_avx(auVar53,auVar53,0x7f);
      auVar40 = vrsqrt14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar49 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
      auVar59 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
      fVar221 = auVar40._0_4_;
      fVar207 = auVar49._0_4_ - auVar59._0_4_ * fVar221 * fVar221 * fVar221;
      auVar240._0_4_ = auVar53._0_4_ * fVar207;
      auVar240._4_4_ = auVar53._4_4_ * fVar207;
      auVar240._8_4_ = auVar53._8_4_ * fVar207;
      auVar240._12_4_ = auVar53._12_4_ * fVar207;
      auVar40 = vdpps_avx(auVar53,auVar54,0x7f);
      auVar49 = vbroadcastss_avx512vl(auVar39);
      auVar49 = vmulps_avx512vl(auVar49,auVar54);
      fVar221 = auVar40._0_4_;
      auVar199._0_4_ = auVar53._0_4_ * fVar221;
      auVar199._4_4_ = auVar53._4_4_ * fVar221;
      auVar199._8_4_ = auVar53._8_4_ * fVar221;
      auVar199._12_4_ = auVar53._12_4_ * fVar221;
      auVar40 = vsubps_avx(auVar49,auVar199);
      auVar49 = vrcp14ss_avx512f(auVar101,ZEXT416(auVar39._0_4_));
      auVar39 = vfnmadd213ss_avx512f(auVar39,auVar49,ZEXT416(0x40000000));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      fVar221 = auVar39._0_4_ * auVar49._0_4_;
      auVar49 = vshufps_avx512vl(auVar48,auVar48,0xff);
      auVar53 = vmulps_avx512vl(auVar49,auVar58);
      auVar54 = vsubps_avx512vl(auVar48,auVar53);
      auVar39 = vshufps_avx(auVar55,auVar55,0xff);
      auVar39 = vmulps_avx512vl(auVar39,auVar58);
      auVar144._0_4_ = auVar39._0_4_ + auVar49._0_4_ * auVar245._0_4_ * fVar99 * auVar50._0_4_;
      auVar144._4_4_ = auVar39._4_4_ + auVar49._4_4_ * auVar245._0_4_ * fVar99 * auVar50._4_4_;
      auVar144._8_4_ = auVar39._8_4_ + auVar49._8_4_ * auVar245._0_4_ * fVar99 * auVar50._8_4_;
      auVar144._12_4_ = auVar39._12_4_ + auVar49._12_4_ * auVar245._0_4_ * fVar99 * auVar50._12_4_;
      auVar39 = vsubps_avx(auVar55,auVar144);
      auVar50 = vaddps_avx512vl(auVar48,auVar53);
      auVar145._0_4_ = fVar216 + auVar144._0_4_;
      auVar145._4_4_ = fVar217 + auVar144._4_4_;
      auVar145._8_4_ = fVar129 + auVar144._8_4_;
      auVar145._12_4_ = fVar138 + auVar144._12_4_;
      auVar49 = vshufps_avx512vl(auVar56,auVar56,0xff);
      auVar232._0_4_ = auVar49._0_4_ * auVar240._0_4_;
      auVar232._4_4_ = auVar49._4_4_ * auVar240._4_4_;
      auVar232._8_4_ = auVar49._8_4_ * auVar240._8_4_;
      auVar232._12_4_ = auVar49._12_4_ * auVar240._12_4_;
      auVar53 = vsubps_avx512vl(auVar56,auVar232);
      auVar58 = vshufps_avx512vl(auVar57,auVar57,0xff);
      auVar58 = vmulps_avx512vl(auVar58,auVar240);
      auVar160._0_4_ = auVar58._0_4_ + auVar49._0_4_ * fVar207 * auVar40._0_4_ * fVar221;
      auVar160._4_4_ = auVar58._4_4_ + auVar49._4_4_ * fVar207 * auVar40._4_4_ * fVar221;
      auVar160._8_4_ = auVar58._8_4_ + auVar49._8_4_ * fVar207 * auVar40._8_4_ * fVar221;
      auVar160._12_4_ = auVar58._12_4_ + auVar49._12_4_ * fVar207 * auVar40._12_4_ * fVar221;
      auVar40 = vsubps_avx512vl(auVar57,auVar160);
      auVar49 = vaddps_avx512vl(auVar56,auVar232);
      auVar57 = vaddps_avx512vl(auVar57,auVar160);
      auVar39 = vmulps_avx512vl(auVar39,auVar43);
      auVar200._0_4_ = auVar54._0_4_ + auVar39._0_4_;
      auVar200._4_4_ = auVar54._4_4_ + auVar39._4_4_;
      auVar200._8_4_ = auVar54._8_4_ + auVar39._8_4_;
      auVar200._12_4_ = auVar54._12_4_ + auVar39._12_4_;
      auVar39 = vmulps_avx512vl(auVar40,auVar43);
      auVar39 = vsubps_avx(auVar53,auVar39);
      auVar40 = vmulps_avx512vl(auVar145,auVar43);
      auVar146._0_4_ = auVar50._0_4_ + auVar40._0_4_;
      auVar146._4_4_ = auVar50._4_4_ + auVar40._4_4_;
      auVar146._8_4_ = auVar50._8_4_ + auVar40._8_4_;
      auVar146._12_4_ = auVar50._12_4_ + auVar40._12_4_;
      auVar40 = vmulps_avx512vl(auVar57,auVar43);
      auVar258 = ZEXT464(0x3f800000);
      auVar40 = vsubps_avx(auVar49,auVar40);
      auVar57 = vbroadcastss_avx512vl(auVar42);
      auVar58 = vsubss_avx512f(ZEXT416(0x3f800000),auVar42);
      auVar102._0_4_ = auVar58._0_4_;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar54 = vmulps_avx512vl(auVar57,auVar54);
      auVar58 = vmulps_avx512vl(auVar57,auVar200);
      auVar39 = vmulps_avx512vl(auVar57,auVar39);
      auVar246._0_4_ = auVar57._0_4_ * auVar53._0_4_;
      auVar246._4_4_ = auVar57._4_4_ * auVar53._4_4_;
      auVar246._8_4_ = auVar57._8_4_ * auVar53._8_4_;
      auVar246._12_4_ = auVar57._12_4_ * auVar53._12_4_;
      local_228 = vfmadd231ps_avx512vl(auVar54,auVar102,auVar52);
      local_238 = vfmadd231ps_avx512vl(auVar58,auVar102,auVar172);
      local_248 = vfmadd231ps_avx512vl(auVar39,auVar102,auVar51);
      local_258 = vfmadd231ps_fma(auVar246,auVar102,auVar44);
      auVar39 = vmulps_avx512vl(auVar57,auVar50);
      auVar50 = vmulps_avx512vl(auVar57,auVar146);
      auVar40 = vmulps_avx512vl(auVar57,auVar40);
      auVar233._0_4_ = auVar57._0_4_ * auVar49._0_4_;
      auVar233._4_4_ = auVar57._4_4_ * auVar49._4_4_;
      auVar233._8_4_ = auVar57._8_4_ * auVar49._8_4_;
      auVar233._12_4_ = auVar57._12_4_ * auVar49._12_4_;
      _local_268 = vfmadd231ps_avx512vl(auVar39,auVar102,auVar41);
      _local_278 = vfmadd231ps_avx512vl(auVar50,auVar102,auVar46);
      _local_288 = vfmadd231ps_avx512vl(auVar40,auVar102,auVar47);
      _local_298 = vfmadd231ps_fma(auVar233,auVar102,auVar45);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar99 = *(float *)(ray + k * 4 + 0x30);
      local_1a8 = vsubps_avx512vl(local_228,auVar39);
      uVar100 = local_1a8._0_4_;
      auVar109._4_4_ = uVar100;
      auVar109._0_4_ = uVar100;
      auVar109._8_4_ = uVar100;
      auVar109._12_4_ = uVar100;
      auVar40 = vshufps_avx(local_1a8,local_1a8,0x55);
      auVar50 = vshufps_avx(local_1a8,local_1a8,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar221 = pre->ray_space[k].vz.field_0.m128[0];
      fVar207 = pre->ray_space[k].vz.field_0.m128[1];
      fVar216 = pre->ray_space[k].vz.field_0.m128[2];
      fVar217 = pre->ray_space[k].vz.field_0.m128[3];
      auVar103._0_4_ = fVar221 * auVar50._0_4_;
      auVar103._4_4_ = fVar207 * auVar50._4_4_;
      auVar103._8_4_ = fVar216 * auVar50._8_4_;
      auVar103._12_4_ = fVar217 * auVar50._12_4_;
      auVar40 = vfmadd231ps_fma(auVar103,(undefined1  [16])aVar4,auVar40);
      auVar54 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar109);
      local_1b8 = vsubps_avx512vl(local_238,auVar39);
      uVar100 = local_1b8._0_4_;
      auVar113._4_4_ = uVar100;
      auVar113._0_4_ = uVar100;
      auVar113._8_4_ = uVar100;
      auVar113._12_4_ = uVar100;
      auVar40 = vshufps_avx(local_1b8,local_1b8,0x55);
      auVar50 = vshufps_avx(local_1b8,local_1b8,0xaa);
      auVar110._0_4_ = fVar221 * auVar50._0_4_;
      auVar110._4_4_ = fVar207 * auVar50._4_4_;
      auVar110._8_4_ = fVar216 * auVar50._8_4_;
      auVar110._12_4_ = fVar217 * auVar50._12_4_;
      auVar40 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar40);
      auVar51 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar113);
      local_1c8 = vsubps_avx512vl(local_248,auVar39);
      uVar100 = local_1c8._0_4_;
      auVar161._4_4_ = uVar100;
      auVar161._0_4_ = uVar100;
      auVar161._8_4_ = uVar100;
      auVar161._12_4_ = uVar100;
      auVar40 = vshufps_avx(local_1c8,local_1c8,0x55);
      auVar50 = vshufps_avx(local_1c8,local_1c8,0xaa);
      auVar114._0_4_ = fVar221 * auVar50._0_4_;
      auVar114._4_4_ = fVar207 * auVar50._4_4_;
      auVar114._8_4_ = fVar216 * auVar50._8_4_;
      auVar114._12_4_ = fVar217 * auVar50._12_4_;
      auVar40 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar4,auVar40);
      auVar52 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar161);
      local_1d8 = vsubps_avx(local_258,auVar39);
      uVar100 = local_1d8._0_4_;
      auVar182._4_4_ = uVar100;
      auVar182._0_4_ = uVar100;
      auVar182._8_4_ = uVar100;
      auVar182._12_4_ = uVar100;
      auVar40 = vshufps_avx(local_1d8,local_1d8,0x55);
      auVar50 = vshufps_avx(local_1d8,local_1d8,0xaa);
      auVar162._0_4_ = fVar221 * auVar50._0_4_;
      auVar162._4_4_ = fVar207 * auVar50._4_4_;
      auVar162._8_4_ = fVar216 * auVar50._8_4_;
      auVar162._12_4_ = fVar217 * auVar50._12_4_;
      auVar40 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar4,auVar40);
      auVar57 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar182);
      local_1e8 = vsubps_avx512vl(_local_268,auVar39);
      uVar100 = local_1e8._0_4_;
      auVar183._4_4_ = uVar100;
      auVar183._0_4_ = uVar100;
      auVar183._8_4_ = uVar100;
      auVar183._12_4_ = uVar100;
      auVar40 = vshufps_avx(local_1e8,local_1e8,0x55);
      auVar50 = vshufps_avx(local_1e8,local_1e8,0xaa);
      auVar201._0_4_ = auVar50._0_4_ * fVar221;
      auVar201._4_4_ = auVar50._4_4_ * fVar207;
      auVar201._8_4_ = auVar50._8_4_ * fVar216;
      auVar201._12_4_ = auVar50._12_4_ * fVar217;
      auVar40 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar4,auVar40);
      auVar58 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar183);
      local_1f8 = vsubps_avx512vl(_local_278,auVar39);
      uVar100 = local_1f8._0_4_;
      auVar184._4_4_ = uVar100;
      auVar184._0_4_ = uVar100;
      auVar184._8_4_ = uVar100;
      auVar184._12_4_ = uVar100;
      auVar40 = vshufps_avx(local_1f8,local_1f8,0x55);
      auVar50 = vshufps_avx(local_1f8,local_1f8,0xaa);
      auVar208._0_4_ = auVar50._0_4_ * fVar221;
      auVar208._4_4_ = auVar50._4_4_ * fVar207;
      auVar208._8_4_ = auVar50._8_4_ * fVar216;
      auVar208._12_4_ = auVar50._12_4_ * fVar217;
      auVar40 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar4,auVar40);
      auVar59 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar184);
      local_208 = vsubps_avx512vl(_local_288,auVar39);
      uVar100 = local_208._0_4_;
      auVar185._4_4_ = uVar100;
      auVar185._0_4_ = uVar100;
      auVar185._8_4_ = uVar100;
      auVar185._12_4_ = uVar100;
      auVar40 = vshufps_avx(local_208,local_208,0x55);
      auVar50 = vshufps_avx(local_208,local_208,0xaa);
      auVar223._0_4_ = auVar50._0_4_ * fVar221;
      auVar223._4_4_ = auVar50._4_4_ * fVar207;
      auVar223._8_4_ = auVar50._8_4_ * fVar216;
      auVar223._12_4_ = auVar50._12_4_ * fVar217;
      auVar40 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar4,auVar40);
      auVar15 = vfmadd231ps_fma(auVar40,(undefined1  [16])aVar3,auVar185);
      local_218 = vsubps_avx(_local_298,auVar39);
      uVar100 = local_218._0_4_;
      auVar132._4_4_ = uVar100;
      auVar132._0_4_ = uVar100;
      auVar132._8_4_ = uVar100;
      auVar132._12_4_ = uVar100;
      auVar39 = vshufps_avx(local_218,local_218,0x55);
      auVar40 = vshufps_avx(local_218,local_218,0xaa);
      auVar173._0_4_ = auVar40._0_4_ * fVar221;
      auVar173._4_4_ = auVar40._4_4_ * fVar207;
      auVar173._8_4_ = auVar40._8_4_ * fVar216;
      auVar173._12_4_ = auVar40._12_4_ * fVar217;
      auVar39 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar4,auVar39);
      auVar16 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar132);
      auVar50 = vmovlhps_avx(auVar54,auVar58);
      auVar49 = vmovlhps_avx(auVar51,auVar59);
      local_338 = vmovlhps_avx(auVar52,auVar15);
      _local_168 = vmovlhps_avx512f(auVar57,auVar16);
      auVar40 = vminps_avx(auVar50,auVar49);
      auVar39 = vmaxps_avx(auVar50,auVar49);
      auVar53 = vminps_avx512vl(local_338,_local_168);
      auVar40 = vminps_avx(auVar40,auVar53);
      auVar53 = vmaxps_avx512vl(local_338,_local_168);
      auVar39 = vmaxps_avx(auVar39,auVar53);
      auVar53 = vshufpd_avx(auVar40,auVar40,3);
      auVar40 = vminps_avx(auVar40,auVar53);
      auVar53 = vshufpd_avx(auVar39,auVar39,3);
      auVar39 = vmaxps_avx(auVar39,auVar53);
      auVar40 = vandps_avx512vl(auVar40,auVar256._0_16_);
      auVar39 = vandps_avx512vl(auVar39,auVar256._0_16_);
      auVar39 = vmaxps_avx(auVar40,auVar39);
      auVar40 = vmovshdup_avx(auVar39);
      auVar39 = vmaxss_avx(auVar40,auVar39);
      local_348 = vmovddup_avx512vl(auVar54);
      auVar257 = ZEXT1664(local_348);
      auVar40 = vmovddup_avx512vl(auVar51);
      auVar53 = vmovddup_avx512vl(auVar52);
      auVar54 = vmovddup_avx512vl(auVar57);
      local_158 = ZEXT416((uint)(auVar39._0_4_ * 9.536743e-07));
      local_148 = vbroadcastss_avx512vl(local_158);
      auVar39 = vxorps_avx512vl(local_148._0_16_,auVar60);
      local_78 = auVar39._0_4_;
      uStack_74 = local_78;
      uStack_70 = local_78;
      uStack_6c = local_78;
      uStack_68 = local_78;
      uStack_64 = local_78;
      uStack_60 = local_78;
      uStack_5c = local_78;
      uVar26 = 0;
      local_178 = vsubps_avx(auVar49,auVar50);
      local_188 = vsubps_avx(local_338,auVar49);
      local_198 = vsubps_avx512vl(_local_168,local_338);
      local_2a8 = vsubps_avx512vl(_local_268,local_228);
      local_2b8 = vsubps_avx512vl(_local_278,local_238);
      local_2c8 = vsubps_avx512vl(_local_288,local_248);
      _local_2d8 = vsubps_avx(_local_298,local_258);
      local_2f8 = vpbroadcastd_avx512vl();
      local_308 = vpbroadcastd_avx512vl();
      auVar39 = ZEXT816(0x3f80000000000000);
      auVar111 = auVar39;
LAB_01b8c0bc:
      auVar51 = vshufps_avx(auVar111,auVar111,0x50);
      auVar241._8_4_ = 0x3f800000;
      auVar241._0_8_ = 0x3f8000003f800000;
      auVar241._12_4_ = 0x3f800000;
      auVar86._16_4_ = 0x3f800000;
      auVar86._0_16_ = auVar241;
      auVar86._20_4_ = 0x3f800000;
      auVar86._24_4_ = 0x3f800000;
      auVar86._28_4_ = 0x3f800000;
      auVar52 = vsubps_avx(auVar241,auVar51);
      fVar221 = auVar51._0_4_;
      fVar129 = auVar58._0_4_;
      auVar133._0_4_ = fVar129 * fVar221;
      fVar207 = auVar51._4_4_;
      fVar138 = auVar58._4_4_;
      auVar133._4_4_ = fVar138 * fVar207;
      fVar216 = auVar51._8_4_;
      auVar133._8_4_ = fVar129 * fVar216;
      fVar217 = auVar51._12_4_;
      auVar133._12_4_ = fVar138 * fVar217;
      fVar139 = auVar59._0_4_;
      auVar147._0_4_ = fVar139 * fVar221;
      fVar153 = auVar59._4_4_;
      auVar147._4_4_ = fVar153 * fVar207;
      auVar147._8_4_ = fVar139 * fVar216;
      auVar147._12_4_ = fVar153 * fVar217;
      fVar154 = auVar15._0_4_;
      auVar163._0_4_ = fVar154 * fVar221;
      fVar168 = auVar15._4_4_;
      auVar163._4_4_ = fVar168 * fVar207;
      auVar163._8_4_ = fVar154 * fVar216;
      auVar163._12_4_ = fVar168 * fVar217;
      fVar169 = auVar16._0_4_;
      auVar115._0_4_ = fVar169 * fVar221;
      fVar178 = auVar16._4_4_;
      auVar115._4_4_ = fVar178 * fVar207;
      auVar115._8_4_ = fVar169 * fVar216;
      auVar115._12_4_ = fVar178 * fVar217;
      auVar57 = vfmadd231ps_avx512vl(auVar133,auVar52,auVar257._0_16_);
      auVar60 = vfmadd231ps_avx512vl(auVar147,auVar52,auVar40);
      auVar61 = vfmadd231ps_avx512vl(auVar163,auVar52,auVar53);
      auVar52 = vfmadd231ps_avx512vl(auVar115,auVar54,auVar52);
      auVar51 = vmovshdup_avx(auVar39);
      fVar207 = auVar39._0_4_;
      fVar221 = (auVar51._0_4_ - fVar207) * 0.04761905;
      auVar80._4_4_ = fVar207;
      auVar80._0_4_ = fVar207;
      auVar80._8_4_ = fVar207;
      auVar80._12_4_ = fVar207;
      auVar80._16_4_ = fVar207;
      auVar80._20_4_ = fVar207;
      auVar80._24_4_ = fVar207;
      auVar80._28_4_ = fVar207;
      auVar70._0_8_ = auVar51._0_8_;
      auVar70._8_8_ = auVar70._0_8_;
      auVar70._16_8_ = auVar70._0_8_;
      auVar70._24_8_ = auVar70._0_8_;
      auVar83 = vsubps_avx(auVar70,auVar80);
      uVar100 = auVar57._0_4_;
      auVar84._4_4_ = uVar100;
      auVar84._0_4_ = uVar100;
      auVar84._8_4_ = uVar100;
      auVar84._12_4_ = uVar100;
      auVar84._16_4_ = uVar100;
      auVar84._20_4_ = uVar100;
      auVar84._24_4_ = uVar100;
      auVar84._28_4_ = uVar100;
      auVar72._8_4_ = 1;
      auVar72._0_8_ = 0x100000001;
      auVar72._12_4_ = 1;
      auVar72._16_4_ = 1;
      auVar72._20_4_ = 1;
      auVar72._24_4_ = 1;
      auVar72._28_4_ = 1;
      auVar82 = ZEXT1632(auVar57);
      auVar81 = vpermps_avx2(auVar72,auVar82);
      auVar66 = vbroadcastss_avx512vl(auVar60);
      auVar76 = ZEXT1632(auVar60);
      auVar67 = vpermps_avx512vl(auVar72,auVar76);
      auVar68 = vbroadcastss_avx512vl(auVar61);
      auVar77 = ZEXT1632(auVar61);
      auVar69 = vpermps_avx512vl(auVar72,auVar77);
      auVar70 = vbroadcastss_avx512vl(auVar52);
      auVar79 = ZEXT1632(auVar52);
      auVar71 = vpermps_avx512vl(auVar72,auVar79);
      auVar85._4_4_ = fVar221;
      auVar85._0_4_ = fVar221;
      auVar85._8_4_ = fVar221;
      auVar85._12_4_ = fVar221;
      auVar85._16_4_ = fVar221;
      auVar85._20_4_ = fVar221;
      auVar85._24_4_ = fVar221;
      auVar85._28_4_ = fVar221;
      auVar78._8_4_ = 2;
      auVar78._0_8_ = 0x200000002;
      auVar78._12_4_ = 2;
      auVar78._16_4_ = 2;
      auVar78._20_4_ = 2;
      auVar78._24_4_ = 2;
      auVar78._28_4_ = 2;
      auVar72 = vpermps_avx512vl(auVar78,auVar82);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar74 = vpermps_avx512vl(auVar73,auVar82);
      auVar75 = vpermps_avx512vl(auVar78,auVar76);
      auVar76 = vpermps_avx512vl(auVar73,auVar76);
      auVar82 = vpermps_avx2(auVar78,auVar77);
      auVar77 = vpermps_avx512vl(auVar73,auVar77);
      auVar78 = vpermps_avx512vl(auVar78,auVar79);
      auVar73 = vpermps_avx512vl(auVar73,auVar79);
      auVar51 = vfmadd132ps_fma(auVar83,auVar80,_DAT_01faff20);
      auVar83 = vsubps_avx(auVar86,ZEXT1632(auVar51));
      auVar79 = vmulps_avx512vl(auVar66,ZEXT1632(auVar51));
      auVar86 = ZEXT1632(auVar51);
      auVar80 = vmulps_avx512vl(auVar67,auVar86);
      auVar52 = vfmadd231ps_fma(auVar79,auVar83,auVar84);
      auVar57 = vfmadd231ps_fma(auVar80,auVar83,auVar81);
      auVar79 = vmulps_avx512vl(auVar68,auVar86);
      auVar80 = vmulps_avx512vl(auVar69,auVar86);
      auVar79 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar66);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar83,auVar67);
      auVar66 = vmulps_avx512vl(auVar70,auVar86);
      auVar84 = ZEXT1632(auVar51);
      auVar67 = vmulps_avx512vl(auVar71,auVar84);
      auVar68 = vfmadd231ps_avx512vl(auVar66,auVar83,auVar68);
      auVar69 = vfmadd231ps_avx512vl(auVar67,auVar83,auVar69);
      fVar216 = auVar51._0_4_;
      fVar217 = auVar51._4_4_;
      auVar66._4_4_ = fVar217 * auVar79._4_4_;
      auVar66._0_4_ = fVar216 * auVar79._0_4_;
      fVar218 = auVar51._8_4_;
      auVar66._8_4_ = fVar218 * auVar79._8_4_;
      fVar219 = auVar51._12_4_;
      auVar66._12_4_ = fVar219 * auVar79._12_4_;
      auVar66._16_4_ = auVar79._16_4_ * 0.0;
      auVar66._20_4_ = auVar79._20_4_ * 0.0;
      auVar66._24_4_ = auVar79._24_4_ * 0.0;
      auVar66._28_4_ = fVar207;
      auVar67._4_4_ = fVar217 * auVar80._4_4_;
      auVar67._0_4_ = fVar216 * auVar80._0_4_;
      auVar67._8_4_ = fVar218 * auVar80._8_4_;
      auVar67._12_4_ = fVar219 * auVar80._12_4_;
      auVar67._16_4_ = auVar80._16_4_ * 0.0;
      auVar67._20_4_ = auVar80._20_4_ * 0.0;
      auVar67._24_4_ = auVar80._24_4_ * 0.0;
      auVar67._28_4_ = auVar81._28_4_;
      auVar52 = vfmadd231ps_fma(auVar66,auVar83,ZEXT1632(auVar52));
      auVar57 = vfmadd231ps_fma(auVar67,auVar83,ZEXT1632(auVar57));
      auVar71._0_4_ = fVar216 * auVar68._0_4_;
      auVar71._4_4_ = fVar217 * auVar68._4_4_;
      auVar71._8_4_ = fVar218 * auVar68._8_4_;
      auVar71._12_4_ = fVar219 * auVar68._12_4_;
      auVar71._16_4_ = auVar68._16_4_ * 0.0;
      auVar71._20_4_ = auVar68._20_4_ * 0.0;
      auVar71._24_4_ = auVar68._24_4_ * 0.0;
      auVar71._28_4_ = 0;
      auVar81._4_4_ = fVar217 * auVar69._4_4_;
      auVar81._0_4_ = fVar216 * auVar69._0_4_;
      auVar81._8_4_ = fVar218 * auVar69._8_4_;
      auVar81._12_4_ = fVar219 * auVar69._12_4_;
      auVar81._16_4_ = auVar69._16_4_ * 0.0;
      auVar81._20_4_ = auVar69._20_4_ * 0.0;
      auVar81._24_4_ = auVar69._24_4_ * 0.0;
      auVar81._28_4_ = auVar68._28_4_;
      auVar60 = vfmadd231ps_fma(auVar71,auVar83,auVar79);
      auVar61 = vfmadd231ps_fma(auVar81,auVar83,auVar80);
      auVar68._28_4_ = auVar80._28_4_;
      auVar68._0_28_ =
           ZEXT1628(CONCAT412(fVar219 * auVar61._12_4_,
                              CONCAT48(fVar218 * auVar61._8_4_,
                                       CONCAT44(fVar217 * auVar61._4_4_,fVar216 * auVar61._0_4_))));
      auVar41 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar219 * auVar60._12_4_,
                                                   CONCAT48(fVar218 * auVar60._8_4_,
                                                            CONCAT44(fVar217 * auVar60._4_4_,
                                                                     fVar216 * auVar60._0_4_)))),
                                auVar83,ZEXT1632(auVar52));
      auVar43 = vfmadd231ps_fma(auVar68,auVar83,ZEXT1632(auVar57));
      auVar81 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar52));
      auVar66 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar57));
      auVar67 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar81 = vmulps_avx512vl(auVar81,auVar67);
      auVar66 = vmulps_avx512vl(auVar66,auVar67);
      auVar79._0_4_ = fVar221 * auVar81._0_4_;
      auVar79._4_4_ = fVar221 * auVar81._4_4_;
      auVar79._8_4_ = fVar221 * auVar81._8_4_;
      auVar79._12_4_ = fVar221 * auVar81._12_4_;
      auVar79._16_4_ = fVar221 * auVar81._16_4_;
      auVar79._20_4_ = fVar221 * auVar81._20_4_;
      auVar79._24_4_ = fVar221 * auVar81._24_4_;
      auVar79._28_4_ = 0;
      auVar81 = vmulps_avx512vl(auVar85,auVar66);
      auVar57 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
      auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01feed00,ZEXT1632(auVar57));
      auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar43),_DAT_01feed00,ZEXT1632(auVar57));
      auVar118._0_4_ = auVar79._0_4_ + auVar41._0_4_;
      auVar118._4_4_ = auVar79._4_4_ + auVar41._4_4_;
      auVar118._8_4_ = auVar79._8_4_ + auVar41._8_4_;
      auVar118._12_4_ = auVar79._12_4_ + auVar41._12_4_;
      auVar118._16_4_ = auVar79._16_4_ + 0.0;
      auVar118._20_4_ = auVar79._20_4_ + 0.0;
      auVar118._24_4_ = auVar79._24_4_ + 0.0;
      auVar118._28_4_ = 0;
      auVar80 = ZEXT1632(auVar57);
      auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar80);
      auVar70 = vaddps_avx512vl(ZEXT1632(auVar43),auVar81);
      auVar71 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,auVar80);
      auVar81 = vsubps_avx(auVar66,auVar69);
      auVar71 = vsubps_avx512vl(auVar68,auVar71);
      auVar69 = vmulps_avx512vl(auVar75,auVar84);
      auVar79 = vmulps_avx512vl(auVar76,auVar84);
      auVar69 = vfmadd231ps_avx512vl(auVar69,auVar83,auVar72);
      auVar72 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar74);
      auVar74 = vmulps_avx512vl(auVar82,auVar84);
      auVar79 = vmulps_avx512vl(auVar77,auVar84);
      auVar74 = vfmadd231ps_avx512vl(auVar74,auVar83,auVar75);
      auVar75 = vfmadd231ps_avx512vl(auVar79,auVar83,auVar76);
      auVar76 = vmulps_avx512vl(auVar78,auVar84);
      auVar73 = vmulps_avx512vl(auVar73,auVar84);
      auVar52 = vfmadd231ps_fma(auVar76,auVar83,auVar82);
      auVar82 = vfmadd231ps_avx512vl(auVar73,auVar83,auVar77);
      auVar73 = vmulps_avx512vl(auVar84,auVar74);
      auVar78 = ZEXT1632(auVar51);
      auVar76 = vmulps_avx512vl(auVar78,auVar75);
      auVar69 = vfmadd231ps_avx512vl(auVar73,auVar83,auVar69);
      auVar72 = vfmadd231ps_avx512vl(auVar76,auVar83,auVar72);
      auVar82 = vmulps_avx512vl(auVar78,auVar82);
      auVar73 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar219 * auVar52._12_4_,
                                              CONCAT48(fVar218 * auVar52._8_4_,
                                                       CONCAT44(fVar217 * auVar52._4_4_,
                                                                fVar216 * auVar52._0_4_)))),auVar83,
                           auVar74);
      auVar74 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar75);
      auVar82._4_4_ = fVar217 * auVar73._4_4_;
      auVar82._0_4_ = fVar216 * auVar73._0_4_;
      auVar82._8_4_ = fVar218 * auVar73._8_4_;
      auVar82._12_4_ = fVar219 * auVar73._12_4_;
      auVar82._16_4_ = auVar73._16_4_ * 0.0;
      auVar82._20_4_ = auVar73._20_4_ * 0.0;
      auVar82._24_4_ = auVar73._24_4_ * 0.0;
      auVar82._28_4_ = auVar77._28_4_;
      auVar75 = vmulps_avx512vl(auVar78,auVar74);
      auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar69);
      auVar75 = vfmadd231ps_avx512vl(auVar75,auVar72,auVar83);
      auVar83 = vsubps_avx512vl(auVar73,auVar69);
      auVar69 = vsubps_avx512vl(auVar74,auVar72);
      auVar72 = vmulps_avx512vl(auVar83,auVar67);
      auVar67 = vmulps_avx512vl(auVar69,auVar67);
      fVar207 = fVar221 * auVar72._0_4_;
      fVar216 = fVar221 * auVar72._4_4_;
      auVar83._4_4_ = fVar216;
      auVar83._0_4_ = fVar207;
      fVar217 = fVar221 * auVar72._8_4_;
      auVar83._8_4_ = fVar217;
      fVar218 = fVar221 * auVar72._12_4_;
      auVar83._12_4_ = fVar218;
      fVar219 = fVar221 * auVar72._16_4_;
      auVar83._16_4_ = fVar219;
      fVar220 = fVar221 * auVar72._20_4_;
      auVar83._20_4_ = fVar220;
      fVar221 = fVar221 * auVar72._24_4_;
      auVar83._24_4_ = fVar221;
      auVar83._28_4_ = auVar72._28_4_;
      auVar67 = vmulps_avx512vl(auVar85,auVar67);
      auVar73 = vpermt2ps_avx512vl(auVar82,_DAT_01feed00,auVar80);
      auVar74 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar80);
      auVar206._0_4_ = auVar82._0_4_ + fVar207;
      auVar206._4_4_ = auVar82._4_4_ + fVar216;
      auVar206._8_4_ = auVar82._8_4_ + fVar217;
      auVar206._12_4_ = auVar82._12_4_ + fVar218;
      auVar206._16_4_ = auVar82._16_4_ + fVar219;
      auVar206._20_4_ = auVar82._20_4_ + fVar220;
      auVar206._24_4_ = auVar82._24_4_ + fVar221;
      auVar206._28_4_ = auVar82._28_4_ + auVar72._28_4_;
      auVar83 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,ZEXT1632(auVar57));
      auVar72 = vaddps_avx512vl(auVar75,auVar67);
      auVar67 = vpermt2ps_avx512vl(auVar67,_DAT_01feed00,ZEXT1632(auVar57));
      auVar83 = vsubps_avx(auVar73,auVar83);
      auVar67 = vsubps_avx512vl(auVar74,auVar67);
      auVar87 = ZEXT1632(auVar41);
      auVar69 = vsubps_avx512vl(auVar82,auVar87);
      auVar89 = ZEXT1632(auVar43);
      auVar76 = vsubps_avx512vl(auVar75,auVar89);
      auVar77 = vsubps_avx512vl(auVar73,auVar66);
      auVar69 = vaddps_avx512vl(auVar69,auVar77);
      auVar77 = vsubps_avx512vl(auVar74,auVar68);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar89,auVar69);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar87,auVar76);
      auVar78 = vmulps_avx512vl(auVar70,auVar69);
      auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar118,auVar76);
      auVar79 = vmulps_avx512vl(auVar71,auVar69);
      auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar81,auVar76);
      auVar80 = vmulps_avx512vl(auVar68,auVar69);
      auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar66,auVar76);
      auVar84 = vmulps_avx512vl(auVar75,auVar69);
      auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar82,auVar76);
      auVar85 = vmulps_avx512vl(auVar72,auVar69);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar206,auVar76);
      auVar86 = vmulps_avx512vl(auVar67,auVar69);
      auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar83,auVar76);
      auVar69 = vmulps_avx512vl(auVar74,auVar69);
      auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar73,auVar76);
      auVar76 = vminps_avx512vl(auVar77,auVar78);
      auVar77 = vmaxps_avx512vl(auVar77,auVar78);
      auVar78 = vminps_avx512vl(auVar79,auVar80);
      auVar76 = vminps_avx512vl(auVar76,auVar78);
      auVar78 = vmaxps_avx512vl(auVar79,auVar80);
      auVar77 = vmaxps_avx512vl(auVar77,auVar78);
      auVar78 = vminps_avx512vl(auVar84,auVar85);
      auVar79 = vmaxps_avx512vl(auVar84,auVar85);
      auVar80 = vminps_avx512vl(auVar86,auVar69);
      auVar78 = vminps_avx512vl(auVar78,auVar80);
      auVar76 = vminps_avx512vl(auVar76,auVar78);
      auVar69 = vmaxps_avx512vl(auVar86,auVar69);
      auVar69 = vmaxps_avx512vl(auVar79,auVar69);
      auVar77 = vmaxps_avx512vl(auVar77,auVar69);
      uVar13 = vcmpps_avx512vl(auVar76,local_148,2);
      auVar69._4_4_ = uStack_74;
      auVar69._0_4_ = local_78;
      auVar69._8_4_ = uStack_70;
      auVar69._12_4_ = uStack_6c;
      auVar69._16_4_ = uStack_68;
      auVar69._20_4_ = uStack_64;
      auVar69._24_4_ = uStack_60;
      auVar69._28_4_ = uStack_5c;
      uVar14 = vcmpps_avx512vl(auVar77,auVar69,5);
      bVar23 = (byte)uVar13 & (byte)uVar14 & 0x7f;
      if (bVar23 == 0) {
        auVar39 = vxorps_avx512vl(auVar77._0_16_,auVar77._0_16_);
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      }
      else {
        auVar76 = vsubps_avx512vl(auVar66,auVar87);
        auVar77 = vsubps_avx512vl(auVar68,auVar89);
        auVar78 = vsubps_avx512vl(auVar73,auVar82);
        auVar76 = vaddps_avx512vl(auVar76,auVar78);
        auVar78 = vsubps_avx512vl(auVar74,auVar75);
        auVar77 = vaddps_avx512vl(auVar77,auVar78);
        auVar78 = vmulps_avx512vl(auVar89,auVar76);
        auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar77,auVar87);
        auVar70 = vmulps_avx512vl(auVar70,auVar76);
        auVar70 = vfnmadd213ps_avx512vl(auVar118,auVar77,auVar70);
        auVar71 = vmulps_avx512vl(auVar71,auVar76);
        auVar71 = vfnmadd213ps_avx512vl(auVar81,auVar77,auVar71);
        auVar81 = vmulps_avx512vl(auVar68,auVar76);
        auVar68 = vfnmadd231ps_avx512vl(auVar81,auVar77,auVar66);
        auVar81 = vmulps_avx512vl(auVar75,auVar76);
        auVar75 = vfnmadd231ps_avx512vl(auVar81,auVar77,auVar82);
        auVar81 = vmulps_avx512vl(auVar72,auVar76);
        auVar72 = vfnmadd213ps_avx512vl(auVar206,auVar77,auVar81);
        auVar81 = vmulps_avx512vl(auVar67,auVar76);
        auVar79 = vfnmadd213ps_avx512vl(auVar83,auVar77,auVar81);
        auVar83 = vmulps_avx512vl(auVar74,auVar76);
        auVar73 = vfnmadd231ps_avx512vl(auVar83,auVar73,auVar77);
        auVar81 = vminps_avx(auVar78,auVar70);
        auVar83 = vmaxps_avx(auVar78,auVar70);
        auVar66 = vminps_avx(auVar71,auVar68);
        auVar66 = vminps_avx(auVar81,auVar66);
        auVar81 = vmaxps_avx(auVar71,auVar68);
        auVar83 = vmaxps_avx(auVar83,auVar81);
        auVar82 = vminps_avx(auVar75,auVar72);
        auVar81 = vmaxps_avx(auVar75,auVar72);
        auVar67 = vminps_avx(auVar79,auVar73);
        auVar82 = vminps_avx(auVar82,auVar67);
        auVar82 = vminps_avx(auVar66,auVar82);
        auVar66 = vmaxps_avx(auVar79,auVar73);
        auVar81 = vmaxps_avx(auVar81,auVar66);
        auVar83 = vmaxps_avx(auVar83,auVar81);
        uVar13 = vcmpps_avx512vl(auVar83,auVar69,5);
        uVar14 = vcmpps_avx512vl(auVar82,local_148,2);
        bVar23 = bVar23 & (byte)uVar13 & (byte)uVar14;
        if (bVar23 != 0) {
          auStack_328[uVar26] = (uint)bVar23;
          uVar13 = vmovlps_avx(auVar39);
          (&uStack_128)[uVar26] = uVar13;
          uVar38 = vmovlps_avx(auVar111);
          auStack_58[uVar26] = uVar38;
          uVar26 = (ulong)((int)uVar26 + 1);
        }
        auVar39 = vxorps_avx512vl(auVar76._0_16_,auVar76._0_16_);
        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      }
      auVar255 = ZEXT1664(auVar51);
      auVar254 = ZEXT3264(_DAT_01feed20);
      auVar253 = ZEXT1664(auVar52);
      in_ZMM19 = ZEXT3264(auVar83);
      auVar252 = ZEXT1664(auVar39);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar259 = ZEXT1664(auVar39);
      if ((int)uVar26 != 0) {
        do {
          auVar51 = auVar252._0_16_;
          auVar52 = auVar255._0_16_;
          uVar24 = (int)uVar26 - 1;
          uVar27 = (ulong)uVar24;
          uVar6 = auStack_328[uVar27];
          auVar111._8_8_ = 0;
          auVar111._0_8_ = auStack_58[uVar27];
          uVar38 = 0;
          for (uVar31 = (ulong)uVar6; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
          {
            uVar38 = uVar38 + 1;
          }
          uVar29 = uVar6 - 1 & uVar6;
          bVar35 = uVar29 == 0;
          auStack_328[uVar27] = uVar29;
          if (bVar35) {
            uVar26 = (ulong)uVar24;
          }
          auVar104._8_8_ = 0;
          auVar104._0_8_ = uVar38;
          auVar39 = vpunpcklqdq_avx(auVar104,ZEXT416((int)uVar38 + 1));
          auVar39 = vcvtqq2ps_avx512vl(auVar39);
          auVar39 = vmulps_avx512vl(auVar39,auVar253._0_16_);
          uVar100 = *(undefined4 *)((long)&uStack_128 + uVar27 * 8 + 4);
          auVar17._4_4_ = uVar100;
          auVar17._0_4_ = uVar100;
          auVar17._8_4_ = uVar100;
          auVar17._12_4_ = uVar100;
          auVar57 = vmulps_avx512vl(auVar39,auVar17);
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = 0x3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar121,auVar39);
          uVar100 = *(undefined4 *)(&uStack_128 + uVar27);
          auVar18._4_4_ = uVar100;
          auVar18._0_4_ = uVar100;
          auVar18._8_4_ = uVar100;
          auVar18._12_4_ = uVar100;
          auVar39 = vfmadd231ps_avx512vl(auVar57,auVar39,auVar18);
          auVar57 = vmovshdup_avx(auVar39);
          fVar221 = auVar57._0_4_ - auVar39._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar221));
          if (uVar6 == 0 || bVar35) goto LAB_01b8c0bc;
          auVar57 = vshufps_avx(auVar111,auVar111,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar221));
          uVar24 = (uint)uVar26;
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = 0x3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar60 = vsubps_avx(auVar134,auVar57);
          fVar207 = auVar57._0_4_;
          auVar148._0_4_ = fVar207 * fVar129;
          fVar216 = auVar57._4_4_;
          auVar148._4_4_ = fVar216 * fVar138;
          fVar217 = auVar57._8_4_;
          auVar148._8_4_ = fVar217 * fVar129;
          fVar218 = auVar57._12_4_;
          auVar148._12_4_ = fVar218 * fVar138;
          auVar164._0_4_ = fVar207 * fVar139;
          auVar164._4_4_ = fVar216 * fVar153;
          auVar164._8_4_ = fVar217 * fVar139;
          auVar164._12_4_ = fVar218 * fVar153;
          auVar174._0_4_ = fVar207 * fVar154;
          auVar174._4_4_ = fVar216 * fVar168;
          auVar174._8_4_ = fVar217 * fVar154;
          auVar174._12_4_ = fVar218 * fVar168;
          auVar122._0_4_ = fVar207 * fVar169;
          auVar122._4_4_ = fVar216 * fVar178;
          auVar122._8_4_ = fVar217 * fVar169;
          auVar122._12_4_ = fVar218 * fVar178;
          auVar41 = vfmadd231ps_avx512vl(auVar148,auVar60,auVar257._0_16_);
          auVar57 = vfmadd231ps_fma(auVar164,auVar60,auVar40);
          auVar61 = vfmadd231ps_fma(auVar174,auVar60,auVar53);
          auVar60 = vfmadd231ps_fma(auVar122,auVar60,auVar54);
          auVar74._16_16_ = auVar41;
          auVar74._0_16_ = auVar41;
          auVar75._16_16_ = auVar57;
          auVar75._0_16_ = auVar57;
          auVar77._16_16_ = auVar61;
          auVar77._0_16_ = auVar61;
          auVar81 = vpermps_avx512vl(auVar254._0_32_,ZEXT1632(auVar39));
          auVar83 = vsubps_avx(auVar75,auVar74);
          auVar41 = vfmadd213ps_fma(auVar83,auVar81,auVar74);
          auVar83 = vsubps_avx(auVar77,auVar75);
          auVar43 = vfmadd213ps_fma(auVar83,auVar81,auVar75);
          auVar57 = vsubps_avx(auVar60,auVar61);
          auVar76._16_16_ = auVar57;
          auVar76._0_16_ = auVar57;
          auVar57 = vfmadd213ps_fma(auVar76,auVar81,auVar77);
          auVar83 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar41));
          auVar60 = vfmadd213ps_fma(auVar83,auVar81,ZEXT1632(auVar41));
          auVar83 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar43));
          auVar57 = vfmadd213ps_fma(auVar83,auVar81,ZEXT1632(auVar43));
          auVar83 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar60));
          auVar55 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar83,auVar81);
          auVar83 = vmulps_avx512vl(auVar83,in_ZMM19._0_32_);
          auVar73._16_16_ = auVar83._16_16_;
          auVar57 = vmulss_avx512f(ZEXT416((uint)fVar221),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar207 = auVar57._0_4_;
          auVar175._0_8_ =
               CONCAT44(auVar55._4_4_ + fVar207 * auVar83._4_4_,
                        auVar55._0_4_ + fVar207 * auVar83._0_4_);
          auVar175._8_4_ = auVar55._8_4_ + fVar207 * auVar83._8_4_;
          auVar175._12_4_ = auVar55._12_4_ + fVar207 * auVar83._12_4_;
          auVar149._0_4_ = fVar207 * auVar83._16_4_;
          auVar149._4_4_ = fVar207 * auVar83._20_4_;
          auVar149._8_4_ = fVar207 * auVar83._24_4_;
          auVar149._12_4_ = fVar207 * auVar83._28_4_;
          auVar46 = vsubps_avx((undefined1  [16])0x0,auVar149);
          auVar43 = vshufpd_avx(auVar55,auVar55,3);
          auVar42 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar57 = vsubps_avx(auVar43,auVar55);
          auVar60 = vsubps_avx(auVar42,(undefined1  [16])0x0);
          auVar191._0_4_ = auVar57._0_4_ + auVar60._0_4_;
          auVar191._4_4_ = auVar57._4_4_ + auVar60._4_4_;
          auVar191._8_4_ = auVar57._8_4_ + auVar60._8_4_;
          auVar191._12_4_ = auVar57._12_4_ + auVar60._12_4_;
          auVar57 = vshufps_avx(auVar55,auVar55,0xb1);
          auVar60 = vshufps_avx(auVar175,auVar175,0xb1);
          auVar61 = vshufps_avx(auVar46,auVar46,0xb1);
          auVar41 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar242._4_4_ = auVar191._0_4_;
          auVar242._0_4_ = auVar191._0_4_;
          auVar242._8_4_ = auVar191._0_4_;
          auVar242._12_4_ = auVar191._0_4_;
          auVar44 = vshufps_avx(auVar191,auVar191,0x55);
          fVar207 = auVar44._0_4_;
          auVar202._0_4_ = auVar57._0_4_ * fVar207;
          fVar216 = auVar44._4_4_;
          auVar202._4_4_ = auVar57._4_4_ * fVar216;
          fVar217 = auVar44._8_4_;
          auVar202._8_4_ = auVar57._8_4_ * fVar217;
          fVar218 = auVar44._12_4_;
          auVar202._12_4_ = auVar57._12_4_ * fVar218;
          auVar209._0_4_ = auVar60._0_4_ * fVar207;
          auVar209._4_4_ = auVar60._4_4_ * fVar216;
          auVar209._8_4_ = auVar60._8_4_ * fVar217;
          auVar209._12_4_ = auVar60._12_4_ * fVar218;
          auVar224._0_4_ = auVar61._0_4_ * fVar207;
          auVar224._4_4_ = auVar61._4_4_ * fVar216;
          auVar224._8_4_ = auVar61._8_4_ * fVar217;
          auVar224._12_4_ = auVar61._12_4_ * fVar218;
          auVar192._0_4_ = auVar41._0_4_ * fVar207;
          auVar192._4_4_ = auVar41._4_4_ * fVar216;
          auVar192._8_4_ = auVar41._8_4_ * fVar217;
          auVar192._12_4_ = auVar41._12_4_ * fVar218;
          auVar57 = vfmadd231ps_fma(auVar202,auVar242,auVar55);
          auVar60 = vfmadd231ps_fma(auVar209,auVar242,auVar175);
          auVar47 = vfmadd231ps_fma(auVar224,auVar242,auVar46);
          auVar48 = vfmadd231ps_fma(auVar192,(undefined1  [16])0x0,auVar242);
          auVar44 = vshufpd_avx(auVar57,auVar57,1);
          auVar45 = vshufpd_avx(auVar60,auVar60,1);
          auVar56 = vshufpd_avx512vl(auVar47,auVar47,1);
          auVar62 = vshufpd_avx512vl(auVar48,auVar48,1);
          auVar61 = vminss_avx(auVar57,auVar60);
          auVar57 = vmaxss_avx(auVar60,auVar57);
          auVar41 = vminss_avx(auVar47,auVar48);
          auVar60 = vmaxss_avx(auVar48,auVar47);
          auVar61 = vminss_avx(auVar61,auVar41);
          auVar57 = vmaxss_avx(auVar60,auVar57);
          auVar41 = vminss_avx(auVar44,auVar45);
          auVar60 = vmaxss_avx(auVar45,auVar44);
          auVar44 = vminss_avx512f(auVar56,auVar62);
          auVar45 = vmaxss_avx512f(auVar62,auVar56);
          auVar60 = vmaxss_avx(auVar45,auVar60);
          auVar41 = vminss_avx512f(auVar41,auVar44);
          vucomiss_avx512f(auVar61);
          fVar216 = auVar60._0_4_;
          fVar207 = auVar57._0_4_;
          if (uVar24 < 5) {
LAB_01b8c849:
            auVar44 = vucomiss_avx512f(auVar41);
            bVar36 = fVar216 <= -0.0001;
            bVar34 = -0.0001 < fVar207;
            bVar33 = bVar36;
            if (!bVar36) goto LAB_01b8c88f;
            uVar13 = vcmpps_avx512vl(auVar61,auVar44,5);
            uVar14 = vcmpps_avx512vl(auVar41,auVar44,5);
            bVar23 = (byte)uVar13 & (byte)uVar14 & 1;
            bVar36 = bVar34 && bVar23 == 0;
            bVar33 = bVar34 && bVar23 == 0;
            if (bVar34 && bVar23 == 0) goto LAB_01b8c88f;
          }
          else {
            bVar36 = fVar216 == -0.0001;
            bVar33 = NAN(fVar216);
            if (fVar216 <= -0.0001) goto LAB_01b8c849;
LAB_01b8c88f:
            vcmpss_avx512f(auVar61,auVar51,1);
            auVar47 = auVar258._0_16_;
            uVar13 = vcmpss_avx512f(auVar57,auVar51,1);
            bVar34 = (bool)((byte)uVar13 & 1);
            auVar73._0_16_ = auVar47;
            iVar98 = auVar258._0_4_;
            auVar87._4_28_ = auVar73._4_28_;
            auVar87._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * iVar98);
            vucomiss_avx512f(auVar87._0_16_);
            bVar33 = (bool)(!bVar36 | bVar33);
            bVar34 = bVar33 == false;
            auVar89._16_16_ = auVar73._16_16_;
            auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar88._4_28_ = auVar89._4_28_;
            auVar88._0_4_ = (uint)bVar33 * auVar252._0_4_ + (uint)!bVar33 * 0x7f800000;
            auVar45 = auVar88._0_16_;
            auVar91._16_16_ = auVar73._16_16_;
            auVar91._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar90._4_28_ = auVar91._4_28_;
            auVar90._0_4_ = (uint)bVar33 * auVar252._0_4_ + (uint)!bVar33 * -0x800000;
            auVar44 = auVar90._0_16_;
            uVar13 = vcmpss_avx512f(auVar41,auVar51,1);
            bVar36 = (bool)((byte)uVar13 & 1);
            auVar93._16_16_ = auVar73._16_16_;
            auVar93._0_16_ = auVar47;
            auVar92._4_28_ = auVar93._4_28_;
            auVar92._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar98);
            vucomiss_avx512f(auVar92._0_16_);
            if ((bVar33) || (bVar34)) {
              auVar41 = vucomiss_avx512f(auVar61);
              if ((bVar33) || (bVar34)) {
                auVar48 = vxorps_avx512vl(auVar61,auVar259._0_16_);
                auVar61 = vsubss_avx512f(auVar41,auVar61);
                auVar61 = vdivss_avx512f(auVar48,auVar61);
                auVar41 = vsubss_avx512f(auVar47,auVar61);
                auVar41 = vfmadd213ss_avx512f(auVar41,auVar51,auVar61);
                auVar61 = auVar41;
              }
              else {
                auVar41 = vxorps_avx512vl(auVar41,auVar41);
                vucomiss_avx512f(auVar41);
                if ((bVar33) || (auVar61 = auVar47, bVar34)) {
                  auVar41 = ZEXT416(0x7f800000);
                  auVar61 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar45 = vminss_avx512f(auVar45,auVar41);
              auVar44 = vmaxss_avx(auVar61,auVar44);
            }
            uVar13 = vcmpss_avx512f(auVar60,auVar51,1);
            bVar36 = (bool)((byte)uVar13 & 1);
            fVar217 = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * iVar98);
            if ((auVar87._0_4_ != fVar217) || (NAN(auVar87._0_4_) || NAN(fVar217))) {
              if ((fVar216 != fVar207) || (NAN(fVar216) || NAN(fVar207))) {
                auVar57 = vxorps_avx512vl(auVar57,auVar259._0_16_);
                auVar193._0_4_ = auVar57._0_4_ / (fVar216 - fVar207);
                auVar193._4_12_ = auVar57._4_12_;
                auVar57 = vsubss_avx512f(auVar47,auVar193);
                auVar57 = vfmadd213ss_avx512f(auVar57,auVar51,auVar193);
                auVar60 = auVar57;
              }
              else if ((fVar207 != 0.0) ||
                      (auVar57 = auVar47, auVar60 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar207))) {
                auVar57 = SUB6416(ZEXT464(0xff800000),0);
                auVar60 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar45 = vminss_avx(auVar45,auVar60);
              auVar44 = vmaxss_avx(auVar57,auVar44);
            }
            bVar36 = auVar92._0_4_ != fVar217;
            auVar57 = vminss_avx512f(auVar45,auVar47);
            auVar95._16_16_ = auVar73._16_16_;
            auVar95._0_16_ = auVar45;
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (uint)bVar36 * auVar57._0_4_ + (uint)!bVar36 * auVar45._0_4_;
            auVar57 = vmaxss_avx512f(auVar47,auVar44);
            auVar97._16_16_ = auVar73._16_16_;
            auVar97._0_16_ = auVar44;
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (uint)bVar36 * auVar57._0_4_ + (uint)!bVar36 * auVar44._0_4_;
            auVar57 = vmaxss_avx512f(auVar51,auVar94._0_16_);
            auVar60 = vminss_avx512f(auVar96._0_16_,auVar47);
            if (auVar57._0_4_ <= auVar60._0_4_) {
              auVar48 = vmaxss_avx512f(auVar51,ZEXT416((uint)(auVar57._0_4_ + -0.1)));
              auVar62 = vminss_avx512f(ZEXT416((uint)(auVar60._0_4_ + 0.1)),auVar47);
              auVar123._0_8_ = auVar55._0_8_;
              auVar123._8_8_ = auVar123._0_8_;
              auVar210._8_8_ = auVar175._0_8_;
              auVar210._0_8_ = auVar175._0_8_;
              auVar225._8_8_ = auVar46._0_8_;
              auVar225._0_8_ = auVar46._0_8_;
              auVar57 = vshufpd_avx(auVar175,auVar175,3);
              auVar60 = vshufpd_avx(auVar46,auVar46,3);
              auVar61 = vshufps_avx(auVar48,auVar62,0);
              auVar243._8_4_ = 0x3f800000;
              auVar243._0_8_ = 0x3f8000003f800000;
              auVar243._12_4_ = 0x3f800000;
              auVar41 = vsubps_avx(auVar243,auVar61);
              fVar207 = auVar61._0_4_;
              auVar165._0_4_ = fVar207 * auVar43._0_4_;
              fVar216 = auVar61._4_4_;
              auVar165._4_4_ = fVar216 * auVar43._4_4_;
              fVar217 = auVar61._8_4_;
              auVar165._8_4_ = fVar217 * auVar43._8_4_;
              fVar218 = auVar61._12_4_;
              auVar165._12_4_ = fVar218 * auVar43._12_4_;
              auVar176._0_4_ = fVar207 * auVar57._0_4_;
              auVar176._4_4_ = fVar216 * auVar57._4_4_;
              auVar176._8_4_ = fVar217 * auVar57._8_4_;
              auVar176._12_4_ = fVar218 * auVar57._12_4_;
              auVar247._0_4_ = auVar60._0_4_ * fVar207;
              auVar247._4_4_ = auVar60._4_4_ * fVar216;
              auVar247._8_4_ = auVar60._8_4_ * fVar217;
              auVar247._12_4_ = auVar60._12_4_ * fVar218;
              auVar150._0_4_ = fVar207 * auVar42._0_4_;
              auVar150._4_4_ = fVar216 * auVar42._4_4_;
              auVar150._8_4_ = fVar217 * auVar42._8_4_;
              auVar150._12_4_ = fVar218 * auVar42._12_4_;
              auVar43 = vfmadd231ps_fma(auVar165,auVar41,auVar123);
              auVar42 = vfmadd231ps_fma(auVar176,auVar41,auVar210);
              auVar44 = vfmadd231ps_fma(auVar247,auVar41,auVar225);
              auVar45 = vfmadd231ps_fma(auVar150,auVar41,ZEXT816(0));
              auVar60 = vsubss_avx512f(auVar47,auVar48);
              auVar57 = vmovshdup_avx(auVar111);
              auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar48._0_4_)),auVar111,
                                        auVar60);
              auVar60 = vsubss_avx512f(auVar47,auVar62);
              auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar62._0_4_)),auVar111,
                                        auVar60);
              auVar46 = vdivss_avx512f(auVar47,ZEXT416((uint)fVar221));
              auVar57 = vsubps_avx(auVar42,auVar43);
              auVar61 = vmulps_avx512vl(auVar57,auVar52);
              auVar57 = vsubps_avx(auVar44,auVar42);
              auVar41 = vmulps_avx512vl(auVar57,auVar52);
              auVar57 = vsubps_avx(auVar45,auVar44);
              auVar57 = vmulps_avx512vl(auVar57,auVar52);
              auVar60 = vminps_avx(auVar41,auVar57);
              auVar57 = vmaxps_avx(auVar41,auVar57);
              auVar60 = vminps_avx(auVar61,auVar60);
              auVar57 = vmaxps_avx(auVar61,auVar57);
              auVar61 = vshufpd_avx(auVar60,auVar60,3);
              auVar41 = vshufpd_avx(auVar57,auVar57,3);
              auVar60 = vminps_avx(auVar60,auVar61);
              auVar57 = vmaxps_avx(auVar57,auVar41);
              fVar221 = auVar46._0_4_;
              auVar194._0_4_ = auVar60._0_4_ * fVar221;
              auVar194._4_4_ = auVar60._4_4_ * fVar221;
              auVar194._8_4_ = auVar60._8_4_ * fVar221;
              auVar194._12_4_ = auVar60._12_4_ * fVar221;
              auVar186._0_4_ = fVar221 * auVar57._0_4_;
              auVar186._4_4_ = fVar221 * auVar57._4_4_;
              auVar186._8_4_ = fVar221 * auVar57._8_4_;
              auVar186._12_4_ = fVar221 * auVar57._12_4_;
              auVar46 = vdivss_avx512f(auVar47,ZEXT416((uint)(auVar62._0_4_ - auVar56._0_4_)));
              auVar57 = vshufpd_avx(auVar43,auVar43,3);
              auVar60 = vshufpd_avx(auVar42,auVar42,3);
              auVar61 = vshufpd_avx(auVar44,auVar44,3);
              auVar41 = vshufpd_avx(auVar45,auVar45,3);
              auVar57 = vsubps_avx(auVar57,auVar43);
              auVar43 = vsubps_avx(auVar60,auVar42);
              auVar42 = vsubps_avx(auVar61,auVar44);
              auVar41 = vsubps_avx(auVar41,auVar45);
              auVar60 = vminps_avx(auVar57,auVar43);
              auVar57 = vmaxps_avx(auVar57,auVar43);
              auVar61 = vminps_avx(auVar42,auVar41);
              auVar61 = vminps_avx(auVar60,auVar61);
              auVar60 = vmaxps_avx(auVar42,auVar41);
              auVar57 = vmaxps_avx(auVar57,auVar60);
              fVar221 = auVar46._0_4_;
              auVar226._0_4_ = fVar221 * auVar61._0_4_;
              auVar226._4_4_ = fVar221 * auVar61._4_4_;
              auVar226._8_4_ = fVar221 * auVar61._8_4_;
              auVar226._12_4_ = fVar221 * auVar61._12_4_;
              auVar211._0_4_ = fVar221 * auVar57._0_4_;
              auVar211._4_4_ = fVar221 * auVar57._4_4_;
              auVar211._8_4_ = fVar221 * auVar57._8_4_;
              auVar211._12_4_ = fVar221 * auVar57._12_4_;
              auVar41 = vinsertps_avx(auVar39,auVar56,0x10);
              auVar63 = vpermt2ps_avx512vl(auVar39,_DAT_01feecd0,auVar62);
              auVar112._0_4_ = auVar41._0_4_ + auVar63._0_4_;
              auVar112._4_4_ = auVar41._4_4_ + auVar63._4_4_;
              auVar112._8_4_ = auVar41._8_4_ + auVar63._8_4_;
              auVar112._12_4_ = auVar41._12_4_ + auVar63._12_4_;
              auVar19._8_4_ = 0x3f000000;
              auVar19._0_8_ = 0x3f0000003f000000;
              auVar19._12_4_ = 0x3f000000;
              auVar46 = vmulps_avx512vl(auVar112,auVar19);
              auVar60 = vshufps_avx(auVar46,auVar46,0x54);
              uVar100 = auVar46._0_4_;
              auVar116._4_4_ = uVar100;
              auVar116._0_4_ = uVar100;
              auVar116._8_4_ = uVar100;
              auVar116._12_4_ = uVar100;
              auVar43 = vfmadd213ps_avx512vl(local_178,auVar116,auVar50);
              auVar42 = vfmadd213ps_avx512vl(local_188,auVar116,auVar49);
              auVar61 = vfmadd213ps_fma(local_198,auVar116,local_338);
              auVar57 = vsubps_avx(auVar42,auVar43);
              auVar43 = vfmadd213ps_fma(auVar57,auVar116,auVar43);
              auVar57 = vsubps_avx(auVar61,auVar42);
              auVar57 = vfmadd213ps_fma(auVar57,auVar116,auVar42);
              auVar57 = vsubps_avx(auVar57,auVar43);
              auVar61 = vfmadd231ps_fma(auVar43,auVar57,auVar116);
              auVar44 = vmulps_avx512vl(auVar57,auVar52);
              auVar234._8_8_ = auVar61._0_8_;
              auVar234._0_8_ = auVar61._0_8_;
              auVar57 = vshufpd_avx(auVar61,auVar61,3);
              auVar61 = vshufps_avx(auVar46,auVar46,0x55);
              auVar43 = vsubps_avx(auVar57,auVar234);
              auVar42 = vfmadd231ps_fma(auVar234,auVar61,auVar43);
              auVar248._8_8_ = auVar44._0_8_;
              auVar248._0_8_ = auVar44._0_8_;
              auVar57 = vshufpd_avx(auVar44,auVar44,3);
              auVar57 = vsubps_avx512vl(auVar57,auVar248);
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar61,auVar248);
              auVar117._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
              auVar117._8_4_ = auVar43._8_4_ ^ 0x80000000;
              auVar117._12_4_ = auVar43._12_4_ ^ 0x80000000;
              auVar61 = vmovshdup_avx512vl(auVar57);
              auVar249._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
              auVar249._8_4_ = auVar61._8_4_ ^ 0x80000000;
              auVar249._12_4_ = auVar61._12_4_ ^ 0x80000000;
              auVar44 = vmovshdup_avx512vl(auVar43);
              auVar45 = vpermt2ps_avx512vl(auVar249,ZEXT416(5),auVar43);
              auVar61 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar61._0_4_ * auVar43._0_4_)),auVar57,
                                            auVar44);
              auVar43 = vpermt2ps_avx512vl(auVar57,SUB6416(ZEXT464(4),0),auVar117);
              auVar151._0_4_ = auVar61._0_4_;
              auVar151._4_4_ = auVar151._0_4_;
              auVar151._8_4_ = auVar151._0_4_;
              auVar151._12_4_ = auVar151._0_4_;
              auVar57 = vdivps_avx(auVar45,auVar151);
              auVar64 = vdivps_avx512vl(auVar43,auVar151);
              fVar221 = auVar42._0_4_;
              auVar61 = vshufps_avx(auVar42,auVar42,0x55);
              auVar235._0_4_ = fVar221 * auVar57._0_4_ + auVar61._0_4_ * auVar64._0_4_;
              auVar235._4_4_ = fVar221 * auVar57._4_4_ + auVar61._4_4_ * auVar64._4_4_;
              auVar235._8_4_ = fVar221 * auVar57._8_4_ + auVar61._8_4_ * auVar64._8_4_;
              auVar235._12_4_ = fVar221 * auVar57._12_4_ + auVar61._12_4_ * auVar64._12_4_;
              auVar48 = vsubps_avx(auVar60,auVar235);
              auVar61 = vmovshdup_avx(auVar57);
              auVar60 = vinsertps_avx(auVar194,auVar226,0x1c);
              auVar250._0_4_ = auVar61._0_4_ * auVar60._0_4_;
              auVar250._4_4_ = auVar61._4_4_ * auVar60._4_4_;
              auVar250._8_4_ = auVar61._8_4_ * auVar60._8_4_;
              auVar250._12_4_ = auVar61._12_4_ * auVar60._12_4_;
              auVar55 = vinsertps_avx512f(auVar186,auVar211,0x1c);
              auVar61 = vmulps_avx512vl(auVar61,auVar55);
              auVar45 = vminps_avx512vl(auVar250,auVar61);
              auVar42 = vmaxps_avx(auVar61,auVar250);
              auVar44 = vmovshdup_avx(auVar64);
              auVar61 = vinsertps_avx(auVar226,auVar194,0x4c);
              auVar227._0_4_ = auVar44._0_4_ * auVar61._0_4_;
              auVar227._4_4_ = auVar44._4_4_ * auVar61._4_4_;
              auVar227._8_4_ = auVar44._8_4_ * auVar61._8_4_;
              auVar227._12_4_ = auVar44._12_4_ * auVar61._12_4_;
              auVar43 = vinsertps_avx(auVar211,auVar186,0x4c);
              auVar212._0_4_ = auVar44._0_4_ * auVar43._0_4_;
              auVar212._4_4_ = auVar44._4_4_ * auVar43._4_4_;
              auVar212._8_4_ = auVar44._8_4_ * auVar43._8_4_;
              auVar212._12_4_ = auVar44._12_4_ * auVar43._12_4_;
              auVar44 = vminps_avx(auVar227,auVar212);
              auVar45 = vaddps_avx512vl(auVar45,auVar44);
              auVar44 = vmaxps_avx(auVar212,auVar227);
              auVar213._0_4_ = auVar42._0_4_ + auVar44._0_4_;
              auVar213._4_4_ = auVar42._4_4_ + auVar44._4_4_;
              auVar213._8_4_ = auVar42._8_4_ + auVar44._8_4_;
              auVar213._12_4_ = auVar42._12_4_ + auVar44._12_4_;
              auVar228._8_8_ = 0x3f80000000000000;
              auVar228._0_8_ = 0x3f80000000000000;
              auVar42 = vsubps_avx(auVar228,auVar213);
              auVar44 = vsubps_avx(auVar228,auVar45);
              auVar45 = vsubps_avx(auVar41,auVar46);
              auVar46 = vsubps_avx(auVar63,auVar46);
              fVar218 = auVar45._0_4_;
              auVar251._0_4_ = fVar218 * auVar42._0_4_;
              fVar219 = auVar45._4_4_;
              auVar251._4_4_ = fVar219 * auVar42._4_4_;
              fVar220 = auVar45._8_4_;
              auVar251._8_4_ = fVar220 * auVar42._8_4_;
              fVar119 = auVar45._12_4_;
              auVar251._12_4_ = fVar119 * auVar42._12_4_;
              auVar65 = vbroadcastss_avx512vl(auVar57);
              auVar60 = vmulps_avx512vl(auVar65,auVar60);
              auVar55 = vmulps_avx512vl(auVar65,auVar55);
              auVar65 = vminps_avx512vl(auVar60,auVar55);
              auVar55 = vmaxps_avx512vl(auVar55,auVar60);
              auVar60 = vbroadcastss_avx512vl(auVar64);
              auVar61 = vmulps_avx512vl(auVar60,auVar61);
              auVar60 = vmulps_avx512vl(auVar60,auVar43);
              auVar43 = vminps_avx512vl(auVar61,auVar60);
              auVar43 = vaddps_avx512vl(auVar65,auVar43);
              auVar45 = vmulps_avx512vl(auVar45,auVar44);
              fVar221 = auVar46._0_4_;
              auVar214._0_4_ = fVar221 * auVar42._0_4_;
              fVar207 = auVar46._4_4_;
              auVar214._4_4_ = fVar207 * auVar42._4_4_;
              fVar216 = auVar46._8_4_;
              auVar214._8_4_ = fVar216 * auVar42._8_4_;
              fVar217 = auVar46._12_4_;
              auVar214._12_4_ = fVar217 * auVar42._12_4_;
              auVar229._0_4_ = fVar221 * auVar44._0_4_;
              auVar229._4_4_ = fVar207 * auVar44._4_4_;
              auVar229._8_4_ = fVar216 * auVar44._8_4_;
              auVar229._12_4_ = fVar217 * auVar44._12_4_;
              auVar60 = vmaxps_avx(auVar60,auVar61);
              auVar187._0_4_ = auVar55._0_4_ + auVar60._0_4_;
              auVar187._4_4_ = auVar55._4_4_ + auVar60._4_4_;
              auVar187._8_4_ = auVar55._8_4_ + auVar60._8_4_;
              auVar187._12_4_ = auVar55._12_4_ + auVar60._12_4_;
              auVar195._8_8_ = 0x3f800000;
              auVar195._0_8_ = 0x3f800000;
              auVar60 = vsubps_avx(auVar195,auVar187);
              auVar61 = vsubps_avx512vl(auVar195,auVar43);
              auVar244._0_4_ = fVar218 * auVar60._0_4_;
              auVar244._4_4_ = fVar219 * auVar60._4_4_;
              auVar244._8_4_ = fVar220 * auVar60._8_4_;
              auVar244._12_4_ = fVar119 * auVar60._12_4_;
              auVar236._0_4_ = fVar218 * auVar61._0_4_;
              auVar236._4_4_ = fVar219 * auVar61._4_4_;
              auVar236._8_4_ = fVar220 * auVar61._8_4_;
              auVar236._12_4_ = fVar119 * auVar61._12_4_;
              auVar188._0_4_ = fVar221 * auVar60._0_4_;
              auVar188._4_4_ = fVar207 * auVar60._4_4_;
              auVar188._8_4_ = fVar216 * auVar60._8_4_;
              auVar188._12_4_ = fVar217 * auVar60._12_4_;
              auVar196._0_4_ = fVar221 * auVar61._0_4_;
              auVar196._4_4_ = fVar207 * auVar61._4_4_;
              auVar196._8_4_ = fVar216 * auVar61._8_4_;
              auVar196._12_4_ = fVar217 * auVar61._12_4_;
              auVar60 = vminps_avx(auVar244,auVar236);
              auVar61 = vminps_avx512vl(auVar188,auVar196);
              auVar43 = vminps_avx512vl(auVar60,auVar61);
              auVar60 = vmaxps_avx(auVar236,auVar244);
              auVar61 = vmaxps_avx(auVar196,auVar188);
              auVar61 = vmaxps_avx(auVar61,auVar60);
              auVar42 = vminps_avx512vl(auVar251,auVar45);
              auVar60 = vminps_avx(auVar214,auVar229);
              auVar60 = vminps_avx(auVar42,auVar60);
              auVar60 = vhaddps_avx(auVar43,auVar60);
              auVar42 = vmaxps_avx512vl(auVar45,auVar251);
              auVar43 = vmaxps_avx(auVar229,auVar214);
              auVar43 = vmaxps_avx(auVar43,auVar42);
              auVar61 = vhaddps_avx(auVar61,auVar43);
              auVar60 = vshufps_avx(auVar60,auVar60,0xe8);
              auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
              auVar189._0_4_ = auVar60._0_4_ + auVar48._0_4_;
              auVar189._4_4_ = auVar60._4_4_ + auVar48._4_4_;
              auVar189._8_4_ = auVar60._8_4_ + auVar48._8_4_;
              auVar189._12_4_ = auVar60._12_4_ + auVar48._12_4_;
              auVar197._0_4_ = auVar61._0_4_ + auVar48._0_4_;
              auVar197._4_4_ = auVar61._4_4_ + auVar48._4_4_;
              auVar197._8_4_ = auVar61._8_4_ + auVar48._8_4_;
              auVar197._12_4_ = auVar61._12_4_ + auVar48._12_4_;
              auVar60 = vmaxps_avx(auVar41,auVar189);
              auVar61 = vminps_avx(auVar197,auVar63);
              uVar38 = vcmpps_avx512vl(auVar61,auVar60,1);
              if ((uVar38 & 3) == 0) {
                uVar38 = vcmpps_avx512vl(auVar197,auVar63,1);
                uVar13 = vcmpps_avx512vl(auVar39,auVar189,1);
                if (((ushort)uVar13 & (ushort)uVar38 & 1) == 0) {
                  bVar23 = 0;
                }
                else {
                  auVar60 = vmovshdup_avx(auVar189);
                  bVar23 = auVar56._0_4_ < auVar60._0_4_ & (byte)(uVar38 >> 1) & 0x7f;
                }
                if (((3 < uVar24 || uVar6 != 0 && !bVar35) | bVar23) != 1) {
                  auVar111 = vinsertps_avx(auVar56,auVar62,0x10);
                  auVar257 = ZEXT1664(local_348);
                  goto LAB_01b8c0bc;
                }
                lVar28 = 200;
                do {
                  auVar39 = vsubss_avx512f(auVar47,auVar48);
                  fVar216 = auVar39._0_4_;
                  fVar221 = fVar216 * fVar216 * fVar216;
                  auVar39 = vmulss_avx512f(auVar48,ZEXT416(0x40400000));
                  fVar207 = auVar39._0_4_ * fVar216 * fVar216;
                  fVar217 = auVar48._0_4_;
                  auVar39 = vmulss_avx512f(ZEXT416((uint)(fVar217 * fVar217)),ZEXT416(0x40400000));
                  fVar216 = fVar216 * auVar39._0_4_;
                  auVar135._4_4_ = fVar221;
                  auVar135._0_4_ = fVar221;
                  auVar135._8_4_ = fVar221;
                  auVar135._12_4_ = fVar221;
                  auVar124._4_4_ = fVar207;
                  auVar124._0_4_ = fVar207;
                  auVar124._8_4_ = fVar207;
                  auVar124._12_4_ = fVar207;
                  auVar105._4_4_ = fVar216;
                  auVar105._0_4_ = fVar216;
                  auVar105._8_4_ = fVar216;
                  auVar105._12_4_ = fVar216;
                  fVar217 = fVar217 * fVar217 * fVar217;
                  auVar166._0_4_ = (float)local_168._0_4_ * fVar217;
                  auVar166._4_4_ = (float)local_168._4_4_ * fVar217;
                  auVar166._8_4_ = fStack_160 * fVar217;
                  auVar166._12_4_ = fStack_15c * fVar217;
                  auVar39 = vfmadd231ps_fma(auVar166,local_338,auVar105);
                  auVar39 = vfmadd231ps_fma(auVar39,auVar49,auVar124);
                  auVar39 = vfmadd231ps_fma(auVar39,auVar50,auVar135);
                  auVar106._8_8_ = auVar39._0_8_;
                  auVar106._0_8_ = auVar39._0_8_;
                  auVar39 = vshufpd_avx(auVar39,auVar39,3);
                  auVar60 = vshufps_avx(auVar48,auVar48,0x55);
                  auVar39 = vsubps_avx(auVar39,auVar106);
                  auVar60 = vfmadd213ps_fma(auVar39,auVar60,auVar106);
                  fVar221 = auVar60._0_4_;
                  auVar39 = vshufps_avx(auVar60,auVar60,0x55);
                  auVar107._0_4_ = auVar57._0_4_ * fVar221 + auVar64._0_4_ * auVar39._0_4_;
                  auVar107._4_4_ = auVar57._4_4_ * fVar221 + auVar64._4_4_ * auVar39._4_4_;
                  auVar107._8_4_ = auVar57._8_4_ * fVar221 + auVar64._8_4_ * auVar39._8_4_;
                  auVar107._12_4_ = auVar57._12_4_ * fVar221 + auVar64._12_4_ * auVar39._12_4_;
                  auVar48 = vsubps_avx(auVar48,auVar107);
                  auVar39 = vandps_avx512vl(auVar60,auVar256._0_16_);
                  auVar60 = vprolq_avx512vl(auVar39,0x20);
                  auVar39 = vmaxss_avx(auVar60,auVar39);
                  bVar35 = (float)local_158._0_4_ < auVar39._0_4_;
                  if (auVar39._0_4_ < (float)local_158._0_4_) {
                    auVar39 = vucomiss_avx512f(auVar51);
                    if (bVar35) break;
                    auVar57 = vucomiss_avx512f(auVar39);
                    auVar258 = ZEXT1664(auVar57);
                    if (bVar35) break;
                    vmovshdup_avx(auVar39);
                    auVar57 = vucomiss_avx512f(auVar51);
                    if (bVar35) break;
                    auVar60 = vucomiss_avx512f(auVar57);
                    auVar258 = ZEXT1664(auVar60);
                    if (bVar35) break;
                    auVar61 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar47 = vinsertps_avx(auVar61,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar61 = vdpps_avx(auVar47,local_1a8,0x7f);
                    auVar41 = vdpps_avx(auVar47,local_1b8,0x7f);
                    auVar43 = vdpps_avx(auVar47,local_1c8,0x7f);
                    auVar42 = vdpps_avx(auVar47,local_1d8,0x7f);
                    auVar44 = vdpps_avx(auVar47,local_1e8,0x7f);
                    auVar45 = vdpps_avx(auVar47,local_1f8,0x7f);
                    auVar46 = vdpps_avx(auVar47,local_208,0x7f);
                    auVar47 = vdpps_avx(auVar47,local_218,0x7f);
                    auVar48 = vsubss_avx512f(auVar60,auVar57);
                    fVar217 = auVar57._0_4_;
                    auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar44._0_4_)),auVar48,
                                              auVar61);
                    auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar217)),auVar48,
                                              auVar41);
                    auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar217)),auVar48,
                                              auVar43);
                    auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * auVar47._0_4_)),auVar48,
                                              auVar42);
                    auVar60 = vsubss_avx512f(auVar60,auVar39);
                    auVar198._0_4_ = auVar60._0_4_;
                    fVar221 = auVar198._0_4_ * auVar198._0_4_ * auVar198._0_4_;
                    auVar60 = vmulss_avx512f(auVar39,ZEXT416(0x40400000));
                    fVar207 = auVar60._0_4_ * auVar198._0_4_ * auVar198._0_4_;
                    local_d8 = auVar39._0_4_;
                    auVar125._0_4_ = local_d8 * local_d8;
                    auVar125._4_4_ = auVar39._4_4_ * auVar39._4_4_;
                    auVar125._8_4_ = auVar39._8_4_ * auVar39._8_4_;
                    auVar125._12_4_ = auVar39._12_4_ * auVar39._12_4_;
                    auVar60 = vmulss_avx512f(auVar125,ZEXT416(0x40400000));
                    fVar216 = auVar198._0_4_ * auVar60._0_4_;
                    fVar219 = local_d8 * auVar125._0_4_;
                    auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar219 * auVar43._0_4_)),
                                              ZEXT416((uint)fVar216),auVar41);
                    auVar60 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar207),auVar61);
                    auVar57 = vfmadd231ss_fma(auVar60,ZEXT416((uint)fVar221),auVar57);
                    fVar218 = auVar57._0_4_;
                    if ((fVar218 < fVar99) ||
                       (fVar220 = *(float *)(ray + k * 4 + 0x80), fVar220 < fVar218)) break;
                    local_c8 = vshufps_avx(auVar39,auVar39,0x55);
                    auVar190._8_4_ = 0x3f800000;
                    auVar190._0_8_ = 0x3f8000003f800000;
                    auVar190._12_4_ = 0x3f800000;
                    auVar39 = vsubps_avx(auVar190,local_c8);
                    fVar119 = local_c8._0_4_;
                    auVar203._0_4_ = fVar119 * (float)local_268._0_4_;
                    fVar126 = local_c8._4_4_;
                    auVar203._4_4_ = fVar126 * (float)local_268._4_4_;
                    fVar127 = local_c8._8_4_;
                    auVar203._8_4_ = fVar127 * fStack_260;
                    fVar128 = local_c8._12_4_;
                    auVar203._12_4_ = fVar128 * fStack_25c;
                    auVar215._0_4_ = fVar119 * (float)local_278._0_4_;
                    auVar215._4_4_ = fVar126 * (float)local_278._4_4_;
                    auVar215._8_4_ = fVar127 * fStack_270;
                    auVar215._12_4_ = fVar128 * fStack_26c;
                    auVar230._0_4_ = fVar119 * (float)local_288._0_4_;
                    auVar230._4_4_ = fVar126 * (float)local_288._4_4_;
                    auVar230._8_4_ = fVar127 * fStack_280;
                    auVar230._12_4_ = fVar128 * fStack_27c;
                    auVar237._0_4_ = fVar119 * (float)local_298._0_4_;
                    auVar237._4_4_ = fVar126 * (float)local_298._4_4_;
                    auVar237._8_4_ = fVar127 * fStack_290;
                    auVar237._12_4_ = fVar128 * fStack_28c;
                    auVar57 = vfmadd231ps_fma(auVar203,auVar39,local_228);
                    auVar60 = vfmadd231ps_fma(auVar215,auVar39,local_238);
                    auVar61 = vfmadd231ps_fma(auVar230,auVar39,local_248);
                    auVar41 = vfmadd231ps_fma(auVar237,auVar39,local_258);
                    auVar39 = vsubps_avx(auVar60,auVar57);
                    auVar57 = vsubps_avx(auVar61,auVar60);
                    auVar60 = vsubps_avx(auVar41,auVar61);
                    auVar238._0_4_ = local_d8 * auVar57._0_4_;
                    auVar238._4_4_ = local_d8 * auVar57._4_4_;
                    auVar238._8_4_ = local_d8 * auVar57._8_4_;
                    auVar238._12_4_ = local_d8 * auVar57._12_4_;
                    auVar198._4_4_ = auVar198._0_4_;
                    auVar198._8_4_ = auVar198._0_4_;
                    auVar198._12_4_ = auVar198._0_4_;
                    auVar39 = vfmadd231ps_fma(auVar238,auVar198,auVar39);
                    auVar204._0_4_ = local_d8 * auVar60._0_4_;
                    auVar204._4_4_ = local_d8 * auVar60._4_4_;
                    auVar204._8_4_ = local_d8 * auVar60._8_4_;
                    auVar204._12_4_ = local_d8 * auVar60._12_4_;
                    auVar57 = vfmadd231ps_fma(auVar204,auVar198,auVar57);
                    auVar205._0_4_ = local_d8 * auVar57._0_4_;
                    auVar205._4_4_ = local_d8 * auVar57._4_4_;
                    auVar205._8_4_ = local_d8 * auVar57._8_4_;
                    auVar205._12_4_ = local_d8 * auVar57._12_4_;
                    auVar39 = vfmadd231ps_fma(auVar205,auVar198,auVar39);
                    auVar39 = vmulps_avx512vl(auVar39,auVar52);
                    pGVar7 = (context->scene->geometries).items[uVar25].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                    auVar177._0_4_ = fVar219 * (float)local_2d8._0_4_;
                    auVar177._4_4_ = fVar219 * (float)local_2d8._4_4_;
                    auVar177._8_4_ = fVar219 * fStack_2d0;
                    auVar177._12_4_ = fVar219 * fStack_2cc;
                    auVar167._4_4_ = fVar216;
                    auVar167._0_4_ = fVar216;
                    auVar167._8_4_ = fVar216;
                    auVar167._12_4_ = fVar216;
                    auVar52 = vfmadd132ps_fma(auVar167,auVar177,local_2c8);
                    auVar152._4_4_ = fVar207;
                    auVar152._0_4_ = fVar207;
                    auVar152._8_4_ = fVar207;
                    auVar152._12_4_ = fVar207;
                    auVar52 = vfmadd132ps_fma(auVar152,auVar52,local_2b8);
                    auVar136._4_4_ = fVar221;
                    auVar136._0_4_ = fVar221;
                    auVar136._8_4_ = fVar221;
                    auVar136._12_4_ = fVar221;
                    auVar60 = vfmadd132ps_fma(auVar136,auVar52,local_2a8);
                    auVar52 = vshufps_avx(auVar60,auVar60,0xc9);
                    auVar57 = vshufps_avx(auVar39,auVar39,0xc9);
                    auVar137._0_4_ = auVar60._0_4_ * auVar57._0_4_;
                    auVar137._4_4_ = auVar60._4_4_ * auVar57._4_4_;
                    auVar137._8_4_ = auVar60._8_4_ * auVar57._8_4_;
                    auVar137._12_4_ = auVar60._12_4_ * auVar57._12_4_;
                    auVar39 = vfmsub231ps_fma(auVar137,auVar39,auVar52);
                    local_e8 = auVar39._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar218;
                      uVar100 = vextractps_avx(auVar39,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar100;
                      uVar100 = vextractps_avx(auVar39,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar100;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                      *(float *)(ray + k * 4 + 0xf0) = local_d8;
                      *(float *)(ray + k * 4 + 0x100) = fVar217;
                      *(uint *)(ray + k * 4 + 0x110) = uVar32;
                      *(int *)(ray + k * 4 + 0x120) = (int)uVar25;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    auVar52 = vshufps_avx(auVar39,auVar39,0x55);
                    local_f8 = vshufps_avx(auVar39,auVar39,0xaa);
                    local_108[0] = (RTCHitN)auVar52[0];
                    local_108[1] = (RTCHitN)auVar52[1];
                    local_108[2] = (RTCHitN)auVar52[2];
                    local_108[3] = (RTCHitN)auVar52[3];
                    local_108[4] = (RTCHitN)auVar52[4];
                    local_108[5] = (RTCHitN)auVar52[5];
                    local_108[6] = (RTCHitN)auVar52[6];
                    local_108[7] = (RTCHitN)auVar52[7];
                    local_108[8] = (RTCHitN)auVar52[8];
                    local_108[9] = (RTCHitN)auVar52[9];
                    local_108[10] = (RTCHitN)auVar52[10];
                    local_108[0xb] = (RTCHitN)auVar52[0xb];
                    local_108[0xc] = (RTCHitN)auVar52[0xc];
                    local_108[0xd] = (RTCHitN)auVar52[0xd];
                    local_108[0xe] = (RTCHitN)auVar52[0xe];
                    local_108[0xf] = (RTCHitN)auVar52[0xf];
                    uStack_e4 = local_e8;
                    uStack_e0 = local_e8;
                    uStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    local_b8 = local_308._0_8_;
                    uStack_b0 = local_308._8_8_;
                    local_a8 = local_2f8;
                    vpcmpeqd_avx2(ZEXT1632(local_2f8),ZEXT1632(local_2f8));
                    uStack_94 = context->user->instID[0];
                    local_98 = uStack_94;
                    uStack_90 = uStack_94;
                    uStack_8c = uStack_94;
                    uStack_88 = context->user->instPrimID[0];
                    uStack_84 = uStack_88;
                    uStack_80 = uStack_88;
                    uStack_7c = uStack_88;
                    *(float *)(ray + k * 4 + 0x80) = fVar218;
                    local_398 = local_318;
                    local_378.valid = (int *)local_398;
                    local_378.geometryUserPtr = pGVar7->userPtr;
                    local_378.context = context->user;
                    local_378.hit = local_108;
                    local_378.N = 4;
                    local_378.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_388 = uVar25;
                      (*pGVar7->intersectionFilterN)(&local_378);
                      auVar254 = ZEXT3264(_DAT_01feed20);
                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar253 = ZEXT1664(auVar39);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      in_ZMM19 = ZEXT3264(auVar83);
                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar259 = ZEXT1664(auVar39);
                      auVar258 = ZEXT464(0x3f800000);
                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar255 = ZEXT1664(auVar39);
                      auVar39 = vxorps_avx512vl(auVar51,auVar51);
                      auVar252 = ZEXT1664(auVar39);
                      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar256 = ZEXT1664(auVar39);
                      uVar25 = local_388;
                    }
                    auVar39 = auVar252._0_16_;
                    uVar38 = vptestmd_avx512vl(local_398,local_398);
                    if ((uVar38 & 0xf) != 0) {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&local_378);
                        auVar254 = ZEXT3264(_DAT_01feed20);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar253 = ZEXT1664(auVar51);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        in_ZMM19 = ZEXT3264(auVar83);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar259 = ZEXT1664(auVar51);
                        auVar258 = ZEXT464(0x3f800000);
                        auVar51 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar255 = ZEXT1664(auVar51);
                        auVar39 = vxorps_avx512vl(auVar39,auVar39);
                        auVar252 = ZEXT1664(auVar39);
                        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar256 = ZEXT1664(auVar39);
                      }
                      uVar38 = vptestmd_avx512vl(local_398,local_398);
                      uVar38 = uVar38 & 0xf;
                      bVar23 = (byte)uVar38;
                      if (bVar23 != 0) {
                        iVar98 = *(int *)(local_378.hit + 4);
                        iVar21 = *(int *)(local_378.hit + 8);
                        iVar22 = *(int *)(local_378.hit + 0xc);
                        bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar33 = SUB81(uVar38 >> 3,0);
                        *(uint *)(local_378.ray + 0xc0) =
                             (uint)(bVar23 & 1) * *(int *)local_378.hit |
                             (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xc0);
                        *(uint *)(local_378.ray + 0xc4) =
                             (uint)bVar35 * iVar98 | (uint)!bVar35 * *(int *)(local_378.ray + 0xc4);
                        *(uint *)(local_378.ray + 200) =
                             (uint)bVar36 * iVar21 | (uint)!bVar36 * *(int *)(local_378.ray + 200);
                        *(uint *)(local_378.ray + 0xcc) =
                             (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(local_378.ray + 0xcc);
                        iVar98 = *(int *)(local_378.hit + 0x14);
                        iVar21 = *(int *)(local_378.hit + 0x18);
                        iVar22 = *(int *)(local_378.hit + 0x1c);
                        bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar33 = SUB81(uVar38 >> 3,0);
                        *(uint *)(local_378.ray + 0xd0) =
                             (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x10) |
                             (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xd0);
                        *(uint *)(local_378.ray + 0xd4) =
                             (uint)bVar35 * iVar98 | (uint)!bVar35 * *(int *)(local_378.ray + 0xd4);
                        *(uint *)(local_378.ray + 0xd8) =
                             (uint)bVar36 * iVar21 | (uint)!bVar36 * *(int *)(local_378.ray + 0xd8);
                        *(uint *)(local_378.ray + 0xdc) =
                             (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(local_378.ray + 0xdc);
                        iVar98 = *(int *)(local_378.hit + 0x24);
                        iVar21 = *(int *)(local_378.hit + 0x28);
                        iVar22 = *(int *)(local_378.hit + 0x2c);
                        bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar33 = SUB81(uVar38 >> 3,0);
                        *(uint *)(local_378.ray + 0xe0) =
                             (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x20) |
                             (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xe0);
                        *(uint *)(local_378.ray + 0xe4) =
                             (uint)bVar35 * iVar98 | (uint)!bVar35 * *(int *)(local_378.ray + 0xe4);
                        *(uint *)(local_378.ray + 0xe8) =
                             (uint)bVar36 * iVar21 | (uint)!bVar36 * *(int *)(local_378.ray + 0xe8);
                        *(uint *)(local_378.ray + 0xec) =
                             (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(local_378.ray + 0xec);
                        iVar98 = *(int *)(local_378.hit + 0x34);
                        iVar21 = *(int *)(local_378.hit + 0x38);
                        iVar22 = *(int *)(local_378.hit + 0x3c);
                        bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar33 = SUB81(uVar38 >> 3,0);
                        *(uint *)(local_378.ray + 0xf0) =
                             (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x30) |
                             (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0xf0);
                        *(uint *)(local_378.ray + 0xf4) =
                             (uint)bVar35 * iVar98 | (uint)!bVar35 * *(int *)(local_378.ray + 0xf4);
                        *(uint *)(local_378.ray + 0xf8) =
                             (uint)bVar36 * iVar21 | (uint)!bVar36 * *(int *)(local_378.ray + 0xf8);
                        *(uint *)(local_378.ray + 0xfc) =
                             (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(local_378.ray + 0xfc);
                        iVar98 = *(int *)(local_378.hit + 0x44);
                        iVar21 = *(int *)(local_378.hit + 0x48);
                        iVar22 = *(int *)(local_378.hit + 0x4c);
                        bVar35 = (bool)((byte)(uVar38 >> 1) & 1);
                        bVar36 = (bool)((byte)(uVar38 >> 2) & 1);
                        bVar33 = SUB81(uVar38 >> 3,0);
                        *(uint *)(local_378.ray + 0x100) =
                             (uint)(bVar23 & 1) * *(int *)(local_378.hit + 0x40) |
                             (uint)!(bool)(bVar23 & 1) * *(int *)(local_378.ray + 0x100);
                        *(uint *)(local_378.ray + 0x104) =
                             (uint)bVar35 * iVar98 | (uint)!bVar35 * *(int *)(local_378.ray + 0x104)
                        ;
                        *(uint *)(local_378.ray + 0x108) =
                             (uint)bVar36 * iVar21 | (uint)!bVar36 * *(int *)(local_378.ray + 0x108)
                        ;
                        *(uint *)(local_378.ray + 0x10c) =
                             (uint)bVar33 * iVar22 | (uint)!bVar33 * *(int *)(local_378.ray + 0x10c)
                        ;
                        auVar39 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x50));
                        *(undefined1 (*) [16])(local_378.ray + 0x110) = auVar39;
                        auVar39 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x60));
                        *(undefined1 (*) [16])(local_378.ray + 0x120) = auVar39;
                        auVar39 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x70));
                        *(undefined1 (*) [16])(local_378.ray + 0x130) = auVar39;
                        auVar39 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_378.hit + 0x80));
                        *(undefined1 (*) [16])(local_378.ray + 0x140) = auVar39;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar220;
                    break;
                  }
                  lVar28 = lVar28 + -1;
                } while (lVar28 != 0);
              }
            }
          }
          auVar257 = ZEXT1664(local_348);
          if (uVar24 == 0) break;
        } while( true );
      }
      uVar100 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar20._4_4_ = uVar100;
      auVar20._0_4_ = uVar100;
      auVar20._8_4_ = uVar100;
      auVar20._12_4_ = uVar100;
      uVar13 = vcmpps_avx512vl(local_2e8,auVar20,2);
      uVar32 = (uint)uVar37 & (uint)uVar37 + 0xf & (uint)uVar13;
      uVar37 = (ulong)uVar32;
    } while (uVar32 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }